

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  ptls_esni_secret_t **esni;
  ptls_key_exchange_algorithm_t *ppVar1;
  ptls_key_exchange_algorithm_t *end;
  byte *pbVar2;
  uint8_t uVar3;
  byte bVar4;
  ushort uVar5;
  en_ptls_state_t eVar6;
  st_ptls_on_extension_t *psVar7;
  char *pcVar8;
  ptls_esni_context_t *ppVar9;
  ptls_hash_algorithm_t *hash;
  ptls_buffer_t *ppVar10;
  ptls_buffer_t *ppVar11;
  st_ptls_hash_context_t *psVar12;
  st_ptls_update_esni_key_t *psVar13;
  st_ptls_update_traffic_key_t *psVar14;
  size_t sVar15;
  anon_struct_72_2_510fbff9 *paVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  ptls_iovec_t pVar20;
  ptls_iovec_t ikm;
  ptls_iovec_t pVar21;
  ptls_iovec_t pubkey_00;
  ptls_iovec_t tbs;
  uint16_t uVar22;
  ptls_aead_context_t *ctx;
  ushort uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  ptls_key_exchange_algorithm_t *ppVar27;
  size_t sVar28;
  ptls_esni_secret_t *ppVar29;
  ptls_esni_context_t **pppVar30;
  ptls_key_schedule_t *ppVar31;
  uint8_t *puVar32;
  size_t sVar33;
  undefined8 *__ptr;
  size_t sVar34;
  size_t sVar35;
  ptls_context_t *ppVar36;
  ulong uVar37;
  ulong uVar38;
  ushort *puVar39;
  ulong uVar40;
  ptls_cipher_suite_t *ppVar41;
  ptls_key_exchange_context_t *ppVar42;
  ulong uVar43;
  ptls_cipher_suite_t *ppVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  size_t sVar48;
  size_t sVar49;
  ptls_hash_context_t **pppVar50;
  uint uVar51;
  ptls_cipher_suite_t **pppVar52;
  ptls_key_exchange_algorithm_t *ppVar53;
  ptls_key_exchange_algorithm_t *ppVar54;
  ulong uVar55;
  size_t *psVar56;
  uint16_t *puVar57;
  ptls_aead_algorithm_t **pppVar58;
  undefined1 *puVar59;
  uint8_t *puVar60;
  ptls_key_exchange_algorithm_t *ppVar61;
  ushort *puVar62;
  size_t sVar63;
  size_t sVar64;
  uint8_t *puVar65;
  size_t sVar66;
  bool bVar67;
  ptls_iovec_t tbs_00;
  ptls_iovec_t pVar68;
  ptls_iovec_t ch_trunc;
  ptls_message_emitter_t *_emitter;
  size_t tbs_start;
  int accept_early_data;
  ptls_iovec_t ecdh_secret;
  anon_struct_24_2_cc7b932a key_share;
  uint8_t iv [16];
  size_t psk_index;
  ptls_iovec_t pubkey;
  st_ptls_client_hello_t ch;
  undefined2 local_640;
  undefined6 uStack_63e;
  undefined2 local_638;
  undefined2 uStack_636;
  undefined4 uStack_634;
  ptls_key_schedule_t *local_630;
  st_ptls_key_exchange_context_t **local_628;
  size_t local_620;
  size_t local_618;
  ptls_aead_context_t *local_5e8;
  int local_5dc;
  ptls_iovec_t local_5d8;
  ptls_key_exchange_algorithm_t *local_5c8;
  ptls_iovec_t pStack_5c0;
  uint8_t auStack_5b0 [8];
  ptls_on_client_hello_parameters_t local_5a8;
  size_t local_540;
  ptls_iovec_t local_538;
  size_t local_528;
  uint8_t *local_520;
  st_ptls_client_hello_t local_518;
  
  uVar37 = message.len;
  puVar32 = message.base;
  memset(&local_518,0,0x4e8);
  local_518.unknown_extensions[0].type = 0xffff;
  local_5c8 = (ptls_key_exchange_algorithm_t *)0x0;
  pStack_5c0.base = (uint8_t *)0x0;
  pStack_5c0.len = 0;
  local_540 = 0xffffffffffffffff;
  local_538.base = (uint8_t *)0x0;
  local_538.len = 0;
  local_5d8.base = (uint8_t *)0x0;
  local_5d8.len = 0;
  local_5dc = 0;
  if (5 < (long)uVar37) {
    iVar25 = 0x28;
    if ((ushort)(*(ushort *)(puVar32 + 4) << 8 | *(ushort *)(puVar32 + 4) >> 8) != 0x303)
    goto LAB_0011d0e4;
    ppVar1 = (ptls_key_exchange_algorithm_t *)(puVar32 + uVar37);
    puVar60 = puVar32 + 6;
    if (((0x25 < uVar37) && (eVar6 = tls->state, local_518.random_bytes = puVar60, uVar37 != 0x26))
       && (uVar40 = (ulong)puVar32[0x26], uVar40 <= uVar37 - 0x27 && uVar40 < 0x21)) {
      local_518.legacy_session_id.base = puVar32 + 0x27;
      local_518.legacy_session_id.len = uVar40;
      if (1 < (ulong)((long)ppVar1 - (long)(puVar32 + uVar40 + 0x27))) {
        uVar5 = *(ushort *)(puVar32 + uVar40 + 0x27);
        uVar55 = (ulong)(ushort)(uVar5 << 8 | uVar5 >> 8);
        puVar60 = puVar32 + uVar40 + 0x29;
        if (uVar55 <= (ulong)((long)ppVar1 - (long)puVar60)) {
          ppVar61 = (ptls_key_exchange_algorithm_t *)(puVar60 + uVar55);
          uVar43 = 0x200;
          uVar38 = uVar55;
          sVar64 = 1;
          do {
            local_518.cipher_suites.base = puVar60;
            local_518.cipher_suites.len = uVar55;
            if ((long)uVar38 < 2) goto LAB_0011d0df;
            lVar47 = uVar43 + uVar40;
            *(ushort *)((long)local_518.signature_algorithms.list + (uVar43 - 0x60)) =
                 *(ushort *)(puVar32 + lVar47 + -0x1d7) << 8 |
                 *(ushort *)(puVar32 + lVar47 + -0x1d7) >> 8;
            local_518.client_ciphers.count = sVar64;
            if (0x23d < uVar43) break;
            uVar43 = uVar43 + 2;
            uVar38 = uVar38 - 2;
            sVar64 = sVar64 + 1;
          } while ((ptls_key_exchange_algorithm_t *)(puVar32 + lVar47 + -0x1d5) != ppVar61);
          if (ppVar61 != ppVar1) {
            uVar40 = (ulong)(byte)ppVar61->id;
            puVar60 = (uint8_t *)((long)&ppVar61->id + 1);
            if (uVar40 <= (ulong)((long)ppVar1 - (long)puVar60) && uVar40 != 0) {
              puVar62 = (ushort *)(puVar60 + uVar40);
              local_5e8 = (st_ptls_aead_context_t *)0x0;
              local_518.compression_methods.ids = puVar60;
              local_518.compression_methods.count = uVar40;
              if (1 < (ulong)((long)ppVar1 - (long)puVar62)) {
                uVar40 = (ulong)(ushort)(*puVar62 << 8 | *puVar62 >> 8);
                ppVar61 = (ptls_key_exchange_algorithm_t *)(puVar62 + 1);
                local_5a8.server_name.base = (uint8_t *)ppVar61;
                if (uVar40 <= (ulong)((long)ppVar1 - (long)ppVar61)) {
                  if (uVar40 != 0) {
                    ppVar54 = (ptls_key_exchange_algorithm_t *)((long)&ppVar61->id + uVar40);
LAB_0011d238:
                    local_5a8.server_name.base = (uint8_t *)ppVar61;
                    if ((long)ppVar54 - (long)ppVar61 < 2) goto LAB_0011d0df;
                    uVar3 = (uint8_t)ppVar61->id;
                    bVar4 = *(byte *)((long)&ppVar61->id + 1);
                    uVar5 = CONCAT11(uVar3,bVar4);
                    local_5a8.server_name.base = &ppVar61->field_0x2;
                    if (uVar5 < 0x40) {
                      if ((*(byte *)((long)&local_5e8 + (ulong)(uVar5 >> 3)) >> (uVar5 & 7) & 1) ==
                          0) {
                        pbVar2 = (byte *)((long)&local_5e8 + (ulong)(bVar4 >> 3));
                        *pbVar2 = *pbVar2 | '\x01' << (bVar4 & 7);
                        goto LAB_0011d29e;
                      }
LAB_0011dc2e:
                      iVar25 = 0x2f;
                      goto LAB_0011d0e4;
                    }
LAB_0011d29e:
                    if ((ulong)((long)ppVar54 - (long)local_5a8.server_name.base) < 2)
                    goto LAB_0011d0df;
                    uVar23 = *(ushort *)&ppVar61->field_0x2 << 8 |
                             *(ushort *)&ppVar61->field_0x2 >> 8;
                    uVar40 = (ulong)uVar23;
                    puVar59 = &ppVar61->field_0x4;
                    local_5a8.server_name.base = puVar59;
                    if ((ulong)((long)ppVar54 - (long)puVar59) < uVar40) goto LAB_0011d0df;
                    psVar7 = tls->ctx->on_extension;
                    uVar22 = CONCAT11(uVar3,bVar4);
                    if (psVar7 != (st_ptls_on_extension_t *)0x0) {
                      pVar68.len._0_2_ = uVar23;
                      pVar68.base = puVar59;
                      pVar68.len._2_6_ = 0;
                      iVar24 = (*psVar7->cb)(psVar7,tls,'\x01',uVar22,pVar68);
                      iVar25 = 1;
                      if (iVar24 != 0) goto LAB_0011d0e4;
                    }
                    end = (ptls_key_exchange_algorithm_t *)(puVar59 + uVar40);
                    puVar60 = local_518.negotiated_groups.base;
                    sVar64 = local_518.negotiated_groups.len;
                    if (uVar22 < 0x1b) {
                      if (uVar22 < 10) {
                        if (uVar22 == 0) {
                          iVar25 = client_hello_decode_server_name
                                             (&local_518.server_name,(uint8_t **)&local_5a8,
                                              (uint8_t *)end);
                          ppVar53 = (ptls_key_exchange_algorithm_t *)local_5a8.server_name.base;
                          if (iVar25 == 0) goto joined_r0x0011db15;
                          goto LAB_0011d0e4;
                        }
                        if (uVar22 != 5) goto switchD_0011d350_caseD_2e;
                        local_518._1248_1_ = local_518._1248_1_ | 1;
                      }
                      else {
                        puVar60 = puVar59;
                        sVar64 = uVar40;
                        if (uVar22 != 10) {
                          if (uVar22 == 0xd) {
                            iVar25 = decode_signature_algorithms
                                               (&local_518.signature_algorithms,
                                                (uint8_t **)&local_5a8,(uint8_t *)end);
                            puVar60 = local_518.negotiated_groups.base;
                            sVar64 = local_518.negotiated_groups.len;
                            if (iVar25 == 0) goto LAB_0011db47;
                            goto LAB_0011d0e4;
                          }
                          if (uVar22 != 0x10) goto switchD_0011d350_caseD_2e;
                          if (1 < uVar23) {
                            uVar40 = (ulong)(ushort)(*(ushort *)&ppVar61->field_0x4 << 8 |
                                                    *(ushort *)&ppVar61->field_0x4 >> 8);
                            local_5a8.server_name.base = &ppVar61->field_0x6;
                            if (uVar40 <= (ulong)((long)end - (long)local_5a8.server_name.base)) {
                              ppVar53 = (ptls_key_exchange_algorithm_t *)
                                        (local_5a8.server_name.base + uVar40);
                              sVar64 = local_518.alpn.count;
                              ppVar61 = (ptls_key_exchange_algorithm_t *)local_5a8.server_name.base;
                              do {
                                if (ppVar53 == ppVar61) goto LAB_0011d0df;
                                uVar40 = (ulong)(byte)ppVar61->id;
                                puVar60 = (uint8_t *)((long)&ppVar61->id + 1);
                                if (((ulong)((long)ppVar53 - (long)puVar60) < uVar40) ||
                                   (uVar40 == 0)) goto LAB_0011d0df;
                                uVar55 = sVar64;
                                if (sVar64 < 0x10) {
                                  uVar55 = sVar64 + 1;
                                  local_518.alpn.list[sVar64].base = puVar60;
                                  local_518.alpn.count = uVar55;
                                  local_518.alpn.list[sVar64].len = uVar40;
                                }
                                ppVar61 = (ptls_key_exchange_algorithm_t *)(puVar60 + uVar40);
                                sVar64 = uVar55;
                              } while (ppVar61 != ppVar53);
                              goto joined_r0x0011db15;
                            }
                          }
                          goto LAB_0011d0df;
                        }
                      }
                    }
                    else {
                      switch(uVar22) {
                      case 0x29:
                        if (1 < uVar23) {
                          uVar40 = (ulong)(ushort)(*(ushort *)&ppVar61->field_0x4 << 8 |
                                                  *(ushort *)&ppVar61->field_0x4 >> 8);
                          local_5a8.server_name.base = &ppVar61->field_0x6;
                          if (uVar40 <= (ulong)((long)end - (long)local_5a8.server_name.base)) {
                            ppVar53 = (ptls_key_exchange_algorithm_t *)
                                      (local_5a8.server_name.base + uVar40);
                            sVar34 = local_518.psk.identities.count;
                            lVar47 = 0;
                            ppVar61 = (ptls_key_exchange_algorithm_t *)local_5a8.server_name.base;
                            do {
                              lVar46 = lVar47;
                              if ((ulong)((long)ppVar53 - (long)ppVar61) < 2) goto LAB_0011d0df;
                              uVar40 = (ulong)(ushort)(ppVar61->id << 8 | ppVar61->id >> 8);
                              puVar59 = &ppVar61->field_0x2;
                              if (((ulong)((long)ppVar53 - (long)puVar59) < uVar40) ||
                                 ((long)ppVar53 - (long)(puVar59 + uVar40) < 4)) goto LAB_0011d0df;
                              uVar55 = sVar34;
                              if (sVar34 < 4) {
                                uVar51 = *(uint *)(puVar59 + uVar40);
                                uVar55 = sVar34 + 1;
                                local_518.psk.identities.count = uVar55;
                                local_518.psk.identities.list[sVar34].identity.base = puVar59;
                                local_518.psk.identities.list[sVar34].identity.len = uVar40;
                                local_518.psk.identities.list[sVar34].obfuscated_ticket_age =
                                     uVar51 >> 0x18 | (uVar51 & 0xff0000) >> 8 |
                                     (uVar51 & 0xff00) << 8 | uVar51 << 0x18;
                                *(undefined8 *)&local_518.psk.identities.list[sVar34].field_0x14 = 0
                                ;
                                *(undefined8 *)
                                 ((long)&local_518.psk.identities.list[sVar34].binder.base + 4) = 0;
                                *(undefined4 *)
                                 ((long)&local_518.psk.identities.list[sVar34].binder.len + 4) = 0;
                              }
                              ppVar61 = (ptls_key_exchange_algorithm_t *)(puVar59 + uVar40 + 4);
                              sVar34 = uVar55;
                              lVar47 = lVar46 + 1;
                            } while (ppVar61 != ppVar53);
                            local_5a8.server_name.base = (uint8_t *)ppVar53;
                            local_518.psk.hash_end = (uint8_t *)ppVar53;
                            if (1 < (ulong)((long)end - (long)ppVar53)) {
                              uVar40 = (ulong)(ushort)(ppVar53->id << 8 | ppVar53->id >> 8);
                              local_5a8.server_name.base = &ppVar53->field_0x2;
                              if ((uVar40 <= (ulong)((long)end - (long)local_5a8.server_name.base))
                                 && (uVar40 != 0)) {
                                ppVar61 = (ptls_key_exchange_algorithm_t *)
                                          (local_5a8.server_name.base + uVar40);
                                sVar34 = (size_t)(byte)ppVar53->field_0x2;
                                puVar65 = &ppVar53->field_0x3;
                                if (sVar34 <= (ulong)((long)ppVar61 - (long)puVar65)) {
                                  psVar56 = &local_518.psk.identities.list[0].binder.len;
                                  uVar40 = 0;
                                  while( true ) {
                                    if (uVar40 < uVar55) {
                                      ((ptls_iovec_t *)(psVar56 + -1))->base = puVar65;
                                      *psVar56 = sVar34;
                                    }
                                    ppVar53 = (ptls_key_exchange_algorithm_t *)(puVar65 + sVar34);
                                    if (ppVar53 == ppVar61) break;
                                    uVar40 = uVar40 + 1;
                                    sVar34 = (size_t)(byte)ppVar53->id;
                                    puVar65 = (uint8_t *)((long)&ppVar53->id + 1);
                                    lVar46 = lVar46 + -1;
                                    psVar56 = psVar56 + 5;
                                    if ((ulong)((long)ppVar61 - (long)puVar65) < sVar34)
                                    goto LAB_0011d0df;
                                  }
                                  if (lVar46 != 0) goto LAB_0011dc2e;
                                  iVar25 = 0x32;
                                  if (ppVar61 == end) break;
                                  goto LAB_0011d0e4;
                                }
                              }
                            }
                          }
                        }
                        goto LAB_0011d0df;
                      case 0x2a:
                        local_518.psk.early_data_indication = 1;
                        break;
                      case 0x2b:
                        if (uVar40 != 0) {
                          local_5a8.server_name.base = &ppVar61->field_0x5;
                          bVar4 = ppVar61->field_0x4;
                          if (((ulong)bVar4 <= (ulong)((long)end - (long)local_5a8.server_name.base)
                              ) && (1 < bVar4)) {
                            ppVar53 = (ptls_key_exchange_algorithm_t *)
                                      (local_5a8.server_name.base + bVar4);
                            puVar62 = (ushort *)local_5a8.server_name.base;
                            lVar47 = 4;
                            do {
                              puVar39 = puVar62 + 1;
                              if (lVar47 == 0) {
                                if ((ptls_key_exchange_algorithm_t *)puVar39 == ppVar53) {
                                  lVar45 = 0;
                                  goto LAB_0011db26;
                                }
                                lVar45 = 0;
                              }
                              else {
                                puVar57 = supported_versions;
                                lVar46 = 0;
                                do {
                                  lVar45 = lVar46;
                                  if (*puVar57 == (uint16_t)(*puVar62 << 8 | *puVar62 >> 8)) break;
                                  lVar46 = lVar46 + 1;
                                  puVar57 = puVar57 + 1;
                                  lVar45 = lVar47;
                                } while (lVar47 != lVar46);
                                if ((ptls_key_exchange_algorithm_t *)puVar39 == ppVar53)
                                goto LAB_0011db62;
                              }
                              puVar62 = puVar39;
                              lVar47 = lVar45;
                              if ((long)ppVar53 - (long)puVar39 < 2) break;
                            } while( true );
                          }
                        }
                        goto LAB_0011d0df;
                      case 0x2c:
                        iVar25 = 0x2f;
                        if ((properties != (ptls_handshake_properties_t *)0x0) &&
                           ((properties->field_0).server.cookie.key != (void *)0x0)) {
                          local_518.cookie.all.base = puVar59;
                          local_518.cookie.all.len = uVar40;
                          if (1 < uVar40) {
                            uVar40 = (ulong)(ushort)(*(ushort *)&ppVar61->field_0x4 << 8 |
                                                    *(ushort *)&ppVar61->field_0x4 >> 8);
                            puVar59 = &ppVar61->field_0x6;
                            local_5a8.server_name.base = puVar59;
                            if ((uVar40 <= (ulong)((long)end - (long)puVar59)) &&
                               (local_518.cookie.tbs.base = puVar59, 1 < uVar40)) {
                              ppVar27 = (ptls_key_exchange_algorithm_t *)(puVar59 + uVar40);
                              uVar40 = (ulong)(ushort)(*(ushort *)&ppVar61->field_0x6 << 8 |
                                                      *(ushort *)&ppVar61->field_0x6 >> 8);
                              if ((uVar40 <= (ulong)((long)ppVar27 - (long)&ppVar61->create)) &&
                                 (uVar40 != 0)) {
                                ppVar53 = (ptls_key_exchange_algorithm_t *)
                                          ((long)&ppVar61->create + uVar40);
                                local_5a8.server_name.base = (uint8_t *)((long)&ppVar61->create + 1)
                                ;
                                uVar40 = (ulong)*(byte *)&ppVar61->create;
                                if ((uVar40 <= (ulong)((long)ppVar53 -
                                                      (long)local_5a8.server_name.base)) &&
                                   (ppVar61 = (ptls_key_exchange_algorithm_t *)
                                              ((long)&((ptls_key_exchange_algorithm_t *)
                                                      local_5a8.server_name.base)->id + uVar40),
                                   local_518.cookie.ch1_hash.base = local_5a8.server_name.base,
                                   local_518.cookie.ch1_hash.len = uVar40, ppVar61 != ppVar53)) {
                                  local_5a8.server_name.base = (uint8_t *)((long)&ppVar61->id + 1);
                                  uVar3 = (uint8_t)ppVar61->id;
                                  if (uVar3 == '\x01') {
                                    local_518.cookie._64_1_ = local_518.cookie._64_1_ | 1;
                                  }
                                  else {
                                    if (uVar3 != '\0') goto LAB_0011d0df;
                                    if ((local_518.cookie._64_1_ & 1) != 0) {
                                      __assert_fail("!ch->cookie.sent_key_share",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                                                  ,0xd05,
                                                  "int decode_client_hello(ptls_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *)"
                                                  );
                                    }
                                  }
                                  if (((ptls_key_exchange_algorithm_t *)local_5a8.server_name.base
                                       == ppVar53) &&
                                     (local_518.cookie.tbs.len = (long)ppVar53 - (long)puVar59,
                                     ppVar27 != ppVar53)) {
                                    local_5a8.server_name.base = &ppVar61->field_0x2;
                                    uVar40 = (ulong)(byte)ppVar53->id;
                                    if ((uVar40 <= (ulong)((long)ppVar27 -
                                                          (long)local_5a8.server_name.base)) &&
                                       (local_518.cookie.signature.base = local_5a8.server_name.base
                                       , local_518.cookie.signature.len = uVar40,
                                       ppVar53 = (ptls_key_exchange_algorithm_t *)
                                                 (local_5a8.server_name.base + uVar40),
                                       (ptls_key_exchange_algorithm_t *)
                                       (local_5a8.server_name.base + uVar40) == ppVar27))
                                    goto joined_r0x0011db15;
                                  }
                                }
                              }
                            }
                          }
                          goto LAB_0011d0df;
                        }
                        goto LAB_0011d0e4;
                      case 0x2d:
                        if (uVar40 != 0) {
                          puVar59 = &ppVar61->field_0x5;
                          uVar40 = (ulong)(byte)ppVar61->field_0x4;
                          local_5a8.server_name.base = puVar59;
                          if ((uVar40 <= (ulong)((long)end - (long)puVar59)) && (uVar40 != 0)) {
                            uVar55 = 0;
                            uVar51 = local_518.psk.ke_modes;
                            do {
                              if ((byte)puVar59[uVar55] < 0x20) {
                                uVar51 = uVar51 | 1 << ((byte)puVar59[uVar55] & 0x1f);
                                local_518.psk.ke_modes = uVar51;
                              }
                              uVar55 = uVar55 + 1;
                              local_5a8.server_name.base = (uint8_t *)(puVar59 + uVar40);
                              ppVar53 = (ptls_key_exchange_algorithm_t *)(puVar59 + uVar40);
                            } while (uVar40 != uVar55);
                            goto joined_r0x0011db15;
                          }
                        }
                        goto LAB_0011d0df;
                      case 0x2e:
                      case 0x2f:
                      case 0x30:
                      case 0x31:
                      case 0x32:
switchD_0011d350_caseD_2e:
                        handle_unknown_extension
                                  (tls,properties,uVar22,puVar59,(uint8_t *)end,
                                   local_518.unknown_extensions);
                        puVar60 = local_518.negotiated_groups.base;
                        sVar64 = local_518.negotiated_groups.len;
                        break;
                      case 0x33:
                        local_518.key_shares.base = puVar59;
                        local_518.key_shares.len = uVar40;
                        break;
                      default:
                        if (uVar22 == 0x1b) {
                          if (uVar40 != 0) {
                            local_5a8.server_name.base = &ppVar61->field_0x5;
                            uVar40 = (ulong)(byte)ppVar61->field_0x4;
                            if (uVar40 <= (ulong)((long)end - (long)local_5a8.server_name.base)) {
                              ppVar53 = (ptls_key_exchange_algorithm_t *)
                                        (local_5a8.server_name.base + uVar40);
                              pppVar58 = (ptls_aead_algorithm_t **)&ppVar61->field_0x6;
                              sVar64 = local_518.cert_compression_algos.count;
                              do {
                                if ((long)uVar40 < 2) goto LAB_0011d0df;
                                uVar55 = sVar64;
                                if (sVar64 < 0x10) {
                                  uVar55 = sVar64 + 1;
                                  local_518.cert_compression_algos.list[sVar64] =
                                       *(ushort *)((long)pppVar58 + -1) << 8 |
                                       *(ushort *)((long)pppVar58 + -1) >> 8;
                                  local_518.cert_compression_algos.count = uVar55;
                                }
                                pppVar58 = (ptls_aead_algorithm_t **)((long)pppVar58 + 2);
                                uVar40 = uVar40 - 2;
                                sVar64 = uVar55;
                              } while (uVar40 != 0);
                              goto joined_r0x0011db15;
                            }
                          }
                          goto LAB_0011d0df;
                        }
                        if (uVar22 != 0xffce) goto switchD_0011d350_caseD_2e;
                        iVar24 = 0x2f;
                        iVar25 = iVar24;
                        if (local_518.esni.cipher != (ptls_cipher_suite_t *)0x0) goto LAB_0011d0e4;
                        if (uVar23 < 2) goto LAB_0011d0df;
                        local_5a8.server_name.base = &ppVar61->field_0x6;
                        pppVar52 = tls->ctx->cipher_suites;
                        ppVar44 = *pppVar52;
                        if (ppVar44 == (ptls_cipher_suite_t *)0x0) goto LAB_0011d0e4;
                        while (ppVar44->id !=
                               (uint16_t)
                               (*(ushort *)&ppVar61->field_0x4 << 8 |
                               *(ushort *)&ppVar61->field_0x4 >> 8)) {
                          ppVar44 = pppVar52[1];
                          pppVar52 = pppVar52 + 1;
                          if (ppVar44 == (ptls_cipher_suite_t *)0x0) goto LAB_0011d0e4;
                        }
                        iVar25 = select_key_share(&local_518.esni.key_share,&local_518.esni.peer_key
                                                  ,tls->ctx->key_exchanges,(uint8_t **)&local_5a8,
                                                  (uint8_t *)end,1);
                        if (iVar25 != 0) goto LAB_0011d0e4;
                        if ((ulong)((long)end - (long)local_5a8.server_name.base) < 2)
                        goto LAB_0011d0df;
                        uVar40 = (ulong)(ushort)(*(uint16_t *)local_5a8.server_name.base << 8 |
                                                *(uint16_t *)local_5a8.server_name.base >> 8);
                        puVar59 = (undefined1 *)((long)local_5a8.server_name.base + 2);
                        if ((ulong)((long)end - (long)puVar59) < uVar40) goto LAB_0011d0df;
                        iVar25 = iVar24;
                        if (uVar40 != (*pppVar52)->hash->digest_size) goto LAB_0011d0e4;
                        puVar62 = (ushort *)(puVar59 + uVar40);
                        local_518.esni.record_digest = puVar59;
                        if ((ulong)((long)end - (long)puVar62) < 2) goto LAB_0011d0df;
                        uVar40 = (ulong)(ushort)(*puVar62 << 8 | *puVar62 >> 8);
                        puVar62 = puVar62 + 1;
                        if ((ulong)((long)end - (long)puVar62) < uVar40) goto LAB_0011d0df;
                        if ((uVar40 < (*pppVar52)->aead->tag_size) ||
                           (iVar25 = 0x32, local_518.esni.encrypted_sni.base = (uint8_t *)puVar62,
                           local_518.esni.encrypted_sni.len = uVar40,
                           (ptls_key_exchange_algorithm_t *)((long)puVar62 + uVar40) != end))
                        goto LAB_0011d0e4;
                        local_518.esni.cipher = *pppVar52;
                        puVar60 = local_518.negotiated_groups.base;
                        sVar64 = local_518.negotiated_groups.len;
                      }
                    }
                    goto LAB_0011db47;
                  }
                  bVar67 = false;
                  goto LAB_0011db8c;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011d0df:
  iVar25 = 0x32;
  goto LAB_0011d0e4;
LAB_0011db62:
  local_5a8.server_name.base = (uint8_t *)ppVar53;
  if (lVar45 != 4) {
LAB_0011db26:
    local_518.selected_version = supported_versions[lVar45];
    local_5a8.server_name.base = (uint8_t *)ppVar53;
  }
joined_r0x0011db15:
  iVar25 = 0x32;
  puVar60 = local_518.negotiated_groups.base;
  sVar64 = local_518.negotiated_groups.len;
  if (ppVar53 != end) goto LAB_0011d0e4;
LAB_0011db47:
  local_518.negotiated_groups.len = sVar64;
  local_518.negotiated_groups.base = puVar60;
  ppVar61 = end;
  if (end == ppVar54) goto LAB_0011dc1d;
  goto LAB_0011d238;
joined_r0x0011dd91:
  iVar25 = iVar24;
  if (ppVar9 == (ptls_esni_context_t *)0x0) goto LAB_0011f1bd;
  ppVar41 = ppVar9->cipher_suites->cipher_suite;
  if (ppVar41 == (ptls_cipher_suite_t *)0x0) goto LAB_0011f1bd;
  paVar16 = ppVar9->cipher_suites;
  while (ppVar41->id != ppVar44->id) {
    ppVar41 = paVar16[1].cipher_suite;
    paVar16 = paVar16 + 1;
    if (ppVar41 == (ptls_cipher_suite_t *)0x0) goto LAB_0011f1bd;
  }
  hash = ppVar44->hash;
  iVar26 = bcmp(paVar16->record_digest,puVar65,hash->digest_size);
  if (iVar26 == 0) {
    ppVar29->version = ppVar9->version;
    local_628 = ppVar9->key_exchanges;
    ppVar42 = *local_628;
    if (ppVar42 != (ptls_key_exchange_context_t *)0x0) {
      goto LAB_0011f0dd;
    }
    goto LAB_0011f1bd;
  }
  ppVar9 = pppVar30[1];
  pppVar30 = pppVar30 + 1;
  goto joined_r0x0011dd91;
  while( true ) {
    ppVar42 = local_628[1];
    local_628 = local_628 + 1;
    if (ppVar42 == (ptls_key_exchange_context_t *)0x0) break;
LAB_0011f0dd:
    if (ppVar42->algo->id == (local_518.esni.key_share)->id) {
      pubkey_00.len = local_518.esni.peer_key.len;
      pubkey_00.base = local_518.esni.peer_key.base;
      local_638 = (undefined2)local_518.esni.peer_key.len;
      uStack_636 = (undefined2)(local_518.esni.peer_key.len >> 0x10);
      uStack_634 = (undefined4)(local_518.esni.peer_key.len >> 0x20);
      iVar25 = build_esni_contents_hash
                         (hash,ppVar29->esni_contents_hash,puVar65,(local_518.esni.key_share)->id,
                          pubkey_00,puVar60);
      if (((iVar25 == 0) &&
          (pVar20.len._0_2_ = local_638, pVar20.base = local_518.esni.peer_key.base,
          pVar20.len._2_2_ = uStack_636, pVar20.len._4_4_ = uStack_634,
          iVar25 = (*(*local_628)->on_exchange)(local_628,0,&(*esni)->secret,pVar20), iVar25 == 0))
         && (sVar28 = local_518.esni.encrypted_sni.len - ppVar44->aead->tag_size, iVar25 = iVar24,
            sVar28 == (ulong)(*pppVar30)->padded_length + 0x10)) {
        __ptr = (undefined8 *)malloc(sVar28);
        local_640 = SUB82(__ptr,0);
        uStack_63e = (undefined6)((ulong)__ptr >> 0x10);
        if (__ptr == (undefined8 *)0x0) {
          iVar25 = 0x201;
        }
        else {
          iVar25 = create_esni_aead(&local_5e8,0,ppVar44,(*esni)->secret,(*esni)->esni_contents_hash
                                   );
          sVar34 = local_518.esni.encrypted_sni.len;
          puVar65 = local_518.esni.encrypted_sni.base;
          sVar64 = local_518.key_shares.len;
          puVar60 = local_518.key_shares.base;
          ctx = local_5e8;
          if (iVar25 == 0) {
            sVar49 = local_5e8->algo->iv_size;
            if (sVar49 - 8 != 0) {
              memcpy(&local_5a8,local_5e8->static_iv,sVar49 - 8);
            }
            lVar47 = -0x40;
            do {
              auStack_5b0[sVar49] = ctx->static_iv[sVar49 - 8];
              sVar49 = sVar49 + 1;
              lVar47 = lVar47 + 8;
            } while (lVar47 != 0);
            sVar64 = (*ctx->do_decrypt)(ctx,__ptr,puVar65,sVar34,&local_5a8,puVar60,sVar64);
            if (sVar64 == (ulong)(*pppVar30)->padded_length + 0x10) {
              ptls_aead_free(ctx);
              if ((ulong)(*pppVar30)->padded_length < 0x10) {
LAB_0011f99d:
                iVar25 = 0x2f;
              }
              else {
                puVar65 = (uint8_t *)((ulong)(*pppVar30)->padded_length + (long)__ptr);
                ppVar29 = *esni;
                uVar17 = __ptr[1];
                *(undefined8 *)ppVar29->nonce = *__ptr;
                *(undefined8 *)(ppVar29->nonce + 8) = uVar17;
                local_520 = (uint8_t *)(__ptr + 2);
                iVar25 = client_hello_decode_server_name(&local_5a8.server_name,&local_520,puVar65);
                puVar60 = local_520;
                if (iVar25 == 0) {
                  for (; puVar60 != puVar65; puVar60 = puVar60 + 1) {
                    if (*puVar60 != '\0') goto LAB_0011f99d;
                  }
                  local_628 = (st_ptls_key_exchange_context_t **)local_5a8.server_name.len;
                  memmove(__ptr,local_5a8.server_name.base,local_5a8.server_name.len);
                  ppVar36 = tls->ctx;
                  psVar13 = ppVar36->update_esni_key;
                  local_630._0_1_ = '\x01';
                  if (psVar13 != (st_ptls_update_esni_key_t *)0x0) {
                    iVar25 = (*psVar13->cb)(psVar13,tls,tls->esni->secret,
                                            (local_518.esni.cipher)->hash,
                                            tls->esni->esni_contents_hash);
                    if (iVar25 != 0) goto LAB_0011d0e4;
                    ppVar36 = tls->ctx;
                  }
                  bVar67 = false;
LAB_0011de5a:
                  if (ppVar36->on_client_hello == (ptls_on_client_hello_t *)0x0) {
                    iVar25 = 0;
                  }
                  else {
                    local_5a8.server_name.base = (uint8_t *)CONCAT62(uStack_63e,local_640);
                    local_5a8.server_name.len = (size_t)local_628;
                    local_5a8.negotiated_protocols.list = local_518.alpn.list;
                    local_5a8.negotiated_protocols.count = local_518.alpn.count;
                    local_5a8.signature_algorithms.list = local_518.signature_algorithms.list;
                    local_5a8.signature_algorithms.count = local_518.signature_algorithms.count;
                    local_5a8.certificate_compression_algorithms.list =
                         local_518.cert_compression_algos.list;
                    local_5a8.certificate_compression_algorithms.count =
                         local_518.cert_compression_algos.count;
                    local_5a8.cipher_suites.list = local_518.client_ciphers.list;
                    local_5a8.cipher_suites.count = local_518.client_ciphers.count;
                    local_5a8._96_1_ = (local_5a8._96_1_ & 0xfe) + (char)local_630;
                    local_5a8.raw_message.base = puVar32;
                    local_5a8.raw_message.len = uVar37;
                    iVar25 = (*ppVar36->on_client_hello->cb)
                                       (ppVar36->on_client_hello,tls,&local_5a8);
                  }
                  if (!bVar67) {
                    free((void *)CONCAT62(uStack_63e,local_640));
                  }
                  if (iVar25 != 0) goto LAB_0011d0e4;
LAB_0011df0b:
                  iVar25 = select_cipher((ptls_cipher_suite_t **)&local_5a8,tls->ctx->cipher_suites,
                                         local_518.cipher_suites.base,
                                         local_518.cipher_suites.base + local_518.cipher_suites.len)
                  ;
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  if (eVar6 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
                    iVar25 = 0x28;
                    if ((ptls_key_exchange_algorithm_t *)tls->cipher_suite !=
                        (ptls_key_exchange_algorithm_t *)local_5a8.server_name.base)
                    goto LAB_0011d0e4;
                  }
                  else {
                    tls->cipher_suite = (ptls_cipher_suite_t *)local_5a8.server_name.base;
                    ppVar31 = key_schedule_new((ptls_cipher_suite_t *)local_5a8.server_name.base,
                                               (ptls_cipher_suite_t **)0x0,
                                               tls->ctx->hkdf_label_prefix__obsolete);
                    tls->key_schedule = ppVar31;
                  }
                  sVar64 = local_518.key_shares.len;
                  puVar60 = local_518.key_shares.base;
                  if ((ushort *)local_518.key_shares.base != (ushort *)0x0 &&
                      local_5c8 == (ptls_key_exchange_algorithm_t *)0x0) {
                    iVar25 = 0x32;
                    if (local_518.key_shares.len < 2) goto LAB_0011d0e4;
                    uVar40 = (ulong)(ushort)(*(ushort *)local_518.key_shares.base << 8 |
                                            *(ushort *)local_518.key_shares.base >> 8);
                    local_5a8.server_name.base = (uint8_t *)((long)local_518.key_shares.base + 2);
                    if (local_518.key_shares.len - 2 < uVar40) goto LAB_0011d0e4;
                    ppVar61 = (ptls_key_exchange_algorithm_t *)
                              ((long)local_518.key_shares.base + uVar40 + 2);
                    iVar25 = select_key_share(&local_5c8,&pStack_5c0,tls->ctx->key_exchanges,
                                              (uint8_t **)&local_5a8,(uint8_t *)ppVar61,0);
                    if (((iVar25 != 0) ||
                        (iVar25 = 0x32,
                        (ptls_key_exchange_algorithm_t *)local_5a8.server_name.base != ppVar61)) ||
                       (iVar25 = 0x32,
                       (ptls_key_exchange_algorithm_t *)local_5a8.server_name.base !=
                       (ptls_key_exchange_algorithm_t *)((long)puVar60 + sVar64)))
                    goto LAB_0011d0e4;
                  }
                  ppVar61 = local_5c8;
                  if (eVar6 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
LAB_0011e05e:
                    bVar67 = false;
                  }
                  else {
                    if (local_5c8 != (ptls_key_exchange_algorithm_t *)0x0 &&
                        local_518.cookie.all.len != 0) {
                      sVar64 = (*tls->ctx->cipher_suites)->hash->digest_size;
                      tbs.len = local_518.cookie.tbs.len;
                      tbs.base = local_518.cookie.tbs.base;
                      iVar25 = calc_cookie_signature
                                         (tls,properties,local_5c8,tbs,(uint8_t *)&local_5a8);
                      if (((iVar25 != 0) ||
                          (iVar25 = 0x28, local_518.cookie.signature.len != sVar64)) ||
                         (iVar24 = (*ptls_mem_equal)(local_518.cookie.signature.base,&local_5a8,
                                                     sVar64), iVar24 == 0)) goto LAB_0011d0e4;
                      key_schedule_update_ch1hash_prefix(tls->key_schedule);
                      sVar64 = local_518.cookie.ch1_hash.len;
                      puVar60 = local_518.cookie.ch1_hash.base;
                      local_630 = tls->key_schedule;
                      if (local_630->num_hashes != 0) {
                        pppVar50 = &local_630->hashes[0].ctx;
                        sVar34 = 0;
                        do {
                          (*(*pppVar50)->update)(*pppVar50,puVar60,sVar64);
                          sVar34 = sVar34 + 1;
                          pppVar50 = pppVar50 + 2;
                        } while (sVar34 != local_630->num_hashes);
                        local_630 = tls->key_schedule;
                      }
                      key_schedule_extract(local_630,(ptls_iovec_t)ZEXT816(0));
                      sVar64 = emitter->buf->off;
                      iVar25 = (*emitter->begin_message)(emitter);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      ppVar10 = emitter->buf;
                      ppVar31 = tls->key_schedule;
                      sVar34 = ppVar10->off;
                      iVar25 = ptls_buffer_reserve(ppVar10,1);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      ppVar10->base[ppVar10->off] = '\x02';
                      ppVar10->off = ppVar10->off + 1;
                      iVar25 = ptls_buffer_reserve(ppVar10,3);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      puVar60 = ppVar10->base;
                      sVar49 = ppVar10->off;
                      puVar60[sVar49 + 2] = '\0';
                      puVar60 = puVar60 + sVar49;
                      puVar60[0] = '\0';
                      puVar60[1] = '\0';
                      local_618 = ppVar10->off;
                      sVar49 = local_618 + 3;
                      ppVar10->off = sVar49;
                      ppVar11 = emitter->buf;
                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      puVar60 = ppVar11->base;
                      sVar63 = ppVar11->off;
                      (puVar60 + sVar63)[0] = '\x03';
                      (puVar60 + sVar63)[1] = '\x03';
                      ppVar11->off = ppVar11->off + 2;
                      iVar25 = ptls_buffer_reserve(emitter->buf,0x20);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      puVar60 = emitter->buf->base;
                      sVar63 = emitter->buf->off;
                      puVar65 = puVar60 + sVar63 + 0x10;
                      puVar65[0] = 0xc2;
                      puVar65[1] = 0xa2;
                      puVar65[2] = '\x11';
                      puVar65[3] = '\x16';
                      puVar65[4] = 'z';
                      puVar65[5] = 0xbb;
                      puVar65[6] = 0x8c;
                      puVar65[7] = '^';
                      puVar65[8] = '\a';
                      puVar65[9] = 0x9e;
                      puVar65[10] = '\t';
                      puVar65[0xb] = 0xe2;
                      puVar65[0xc] = 200;
                      puVar65[0xd] = 0xa8;
                      puVar65[0xe] = '3';
                      puVar65[0xf] = 0x9c;
                      puVar60 = puVar60 + sVar63;
                      puVar60[0] = 0xcf;
                      puVar60[1] = '!';
                      puVar60[2] = 0xad;
                      puVar60[3] = 't';
                      puVar60[4] = 0xe5;
                      puVar60[5] = 0x9a;
                      puVar60[6] = 'a';
                      puVar60[7] = '\x11';
                      puVar60[8] = 0xbe;
                      puVar60[9] = '\x1d';
                      puVar60[10] = 0x8c;
                      puVar60[0xb] = '\x02';
                      puVar60[0xc] = '\x1e';
                      puVar60[0xd] = 'e';
                      puVar60[0xe] = 0xb8;
                      puVar60[0xf] = 0x91;
                      ppVar11 = emitter->buf;
                      ppVar11->off = ppVar11->off + 0x20;
                      iVar25 = ptls_buffer_reserve(ppVar11,1);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      ppVar11->base[ppVar11->off] = '\0';
                      ppVar11->off = ppVar11->off + 1;
                      sVar63 = emitter->buf->off;
                      iVar25 = ptls_buffer__do_pushv
                                         (emitter->buf,local_518.legacy_session_id.base,
                                          local_518.legacy_session_id.len);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      emitter->buf->base[sVar63 - 1] = (char)(int)emitter->buf->off - (char)sVar63;
                      uVar5 = tls->cipher_suite->id;
                      ppVar11 = emitter->buf;
                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      *(ushort *)(ppVar11->base + ppVar11->off) = uVar5 << 8 | uVar5 >> 8;
                      ppVar11->off = ppVar11->off + 2;
                      ppVar11 = emitter->buf;
                      iVar25 = ptls_buffer_reserve(ppVar11,1);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      ppVar11->base[ppVar11->off] = '\0';
                      ppVar11->off = ppVar11->off + 1;
                      ppVar11 = emitter->buf;
                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      puVar60 = ppVar11->base;
                      sVar63 = ppVar11->off;
                      (puVar60 + sVar63)[0] = '\0';
                      (puVar60 + sVar63)[1] = '\0';
                      ppVar11->off = ppVar11->off + 2;
                      ppVar11 = emitter->buf;
                      sVar63 = ppVar11->off;
                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      puVar60 = ppVar11->base;
                      sVar35 = ppVar11->off;
                      (puVar60 + sVar35)[0] = '\0';
                      (puVar60 + sVar35)[1] = '+';
                      ppVar11->off = ppVar11->off + 2;
                      ppVar11 = emitter->buf;
                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                      uVar22 = local_518.selected_version;
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      puVar60 = ppVar11->base;
                      sVar35 = ppVar11->off;
                      (puVar60 + sVar35)[0] = '\0';
                      (puVar60 + sVar35)[1] = '\0';
                      ppVar11->off = ppVar11->off + 2;
                      ppVar11 = emitter->buf;
                      sVar35 = ppVar11->off;
                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      *(uint16_t *)(ppVar11->base + ppVar11->off) = uVar22 << 8 | uVar22 >> 8;
                      ppVar11->off = ppVar11->off + 2;
                      lVar47 = emitter->buf->off - sVar35;
                      emitter->buf->base[sVar35 - 2] = (uint8_t)((ulong)lVar47 >> 8);
                      emitter->buf->base[sVar35 - 1] = (uint8_t)lVar47;
                      if ((local_518.cookie._64_1_ & 1) != 0) {
                        ppVar11 = emitter->buf;
                        iVar25 = ptls_buffer_reserve(ppVar11,2);
                        if (iVar25 != 0) goto LAB_0011d0e4;
                        puVar60 = ppVar11->base;
                        sVar35 = ppVar11->off;
                        (puVar60 + sVar35)[0] = '\0';
                        (puVar60 + sVar35)[1] = '3';
                        ppVar11->off = ppVar11->off + 2;
                        ppVar11 = emitter->buf;
                        iVar25 = ptls_buffer_reserve(ppVar11,2);
                        if (iVar25 != 0) goto LAB_0011d0e4;
                        puVar60 = ppVar11->base;
                        sVar35 = ppVar11->off;
                        (puVar60 + sVar35)[0] = '\0';
                        (puVar60 + sVar35)[1] = '\0';
                        ppVar11->off = ppVar11->off + 2;
                        ppVar11 = emitter->buf;
                        sVar35 = ppVar11->off;
                        uVar5 = ppVar61->id;
                        iVar25 = ptls_buffer_reserve(ppVar11,2);
                        if (iVar25 != 0) goto LAB_0011d0e4;
                        *(ushort *)(ppVar11->base + ppVar11->off) = uVar5 << 8 | uVar5 >> 8;
                        ppVar11->off = ppVar11->off + 2;
                        lVar47 = emitter->buf->off - sVar35;
                        emitter->buf->base[sVar35 - 2] = (uint8_t)((ulong)lVar47 >> 8);
                        emitter->buf->base[sVar35 - 1] = (uint8_t)lVar47;
                      }
                      ppVar11 = emitter->buf;
                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      puVar60 = ppVar11->base;
                      sVar35 = ppVar11->off;
                      (puVar60 + sVar35)[0] = '\0';
                      (puVar60 + sVar35)[1] = ',';
                      ppVar11->off = ppVar11->off + 2;
                      ppVar11 = emitter->buf;
                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      puVar60 = ppVar11->base;
                      sVar35 = ppVar11->off;
                      (puVar60 + sVar35)[0] = '\0';
                      (puVar60 + sVar35)[1] = '\0';
                      ppVar11->off = ppVar11->off + 2;
                      sVar35 = emitter->buf->off;
                      iVar25 = ptls_buffer__do_pushv
                                         (emitter->buf,local_518.cookie.all.base,
                                          local_518.cookie.all.len);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      lVar47 = emitter->buf->off - sVar35;
                      emitter->buf->base[sVar35 - 2] = (uint8_t)((ulong)lVar47 >> 8);
                      emitter->buf->base[sVar35 - 1] = (uint8_t)lVar47;
                      lVar47 = emitter->buf->off - sVar63;
                      emitter->buf->base[sVar63 - 2] = (uint8_t)((ulong)lVar47 >> 8);
                      emitter->buf->base[sVar63 - 1] = (uint8_t)lVar47;
                      sVar63 = ppVar10->off;
                      lVar47 = 0x10;
                      do {
                        ppVar10->base[local_618] =
                             (uint8_t)(sVar63 - sVar49 >> ((byte)lVar47 & 0x3f));
                        lVar47 = lVar47 + -8;
                        local_618 = local_618 + 1;
                      } while (lVar47 != -8);
                      if ((ppVar31 != (ptls_key_schedule_t *)0x0) && (ppVar31->num_hashes != 0)) {
                        puVar60 = ppVar10->base;
                        sVar49 = ppVar10->off;
                        pppVar50 = &ppVar31->hashes[0].ctx;
                        sVar63 = 0;
                        do {
                          (*(*pppVar50)->update)(*pppVar50,puVar60 + sVar34,sVar49 - sVar34);
                          sVar63 = sVar63 + 1;
                          pppVar50 = pppVar50 + 2;
                        } while (sVar63 != ppVar31->num_hashes);
                      }
                      iVar25 = (*emitter->commit_message)(emitter);
                      if (iVar25 != 0) goto LAB_0011d0e4;
                      emitter->buf->off = sVar64;
                      goto LAB_0011e05e;
                    }
                    if (local_5c8 == (ptls_key_exchange_algorithm_t *)0x0) {
LAB_0011e79a:
                      if (local_518.negotiated_groups.base == (uint8_t *)0x0) {
                        iVar25 = 0x6d;
                      }
                      else {
                        iVar25 = select_negotiated_group
                                           ((ptls_key_exchange_algorithm_t **)&local_5a8,
                                            tls->ctx->key_exchanges,local_518.negotiated_groups.base
                                            ,local_518.negotiated_groups.base +
                                             local_518.negotiated_groups.len);
                        if (iVar25 == 0) {
                          local_630 = tls->key_schedule;
                          if (local_630->num_hashes != 0) {
                            pppVar50 = &local_630->hashes[0].ctx;
                            sVar64 = 0;
                            do {
                              (*(*pppVar50)->update)(*pppVar50,puVar32,uVar37);
                              sVar64 = sVar64 + 1;
                              pppVar50 = pppVar50 + 2;
                            } while (sVar64 != local_630->num_hashes);
                            local_630 = tls->key_schedule;
                          }
                          if (local_630->generation != 0) {
                            __assert_fail("tls->key_schedule->generation == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                                          ,0xebe,
                                          "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                         );
                          }
                          if ((properties == (ptls_handshake_properties_t *)0x0) ||
                             ((*(byte *)((long)&properties->field_0 + 0x60) & 2) == 0)) {
                            key_schedule_transform_post_ch1hash(local_630);
                            key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
                            iVar25 = (*emitter->begin_message)(emitter);
                            if (iVar25 == 0) {
                              ppVar10 = emitter->buf;
                              ppVar31 = tls->key_schedule;
                              sVar64 = ppVar10->off;
                              iVar25 = ptls_buffer_reserve(ppVar10,1);
                              if (iVar25 == 0) {
                                ppVar10->base[ppVar10->off] = '\x02';
                                ppVar10->off = ppVar10->off + 1;
                                iVar25 = ptls_buffer_reserve(ppVar10,3);
                                if (iVar25 == 0) {
                                  puVar32 = ppVar10->base;
                                  sVar34 = ppVar10->off;
                                  puVar32[sVar34 + 2] = '\0';
                                  puVar32 = puVar32 + sVar34;
                                  puVar32[0] = '\0';
                                  puVar32[1] = '\0';
                                  local_630 = (ptls_key_schedule_t *)ppVar10->off;
                                  sVar34 = (long)local_630 + 3;
                                  ppVar10->off = sVar34;
                                  ppVar11 = emitter->buf;
                                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                                  if (iVar25 == 0) {
                                    puVar32 = ppVar11->base;
                                    sVar49 = ppVar11->off;
                                    (puVar32 + sVar49)[0] = '\x03';
                                    (puVar32 + sVar49)[1] = '\x03';
                                    ppVar11->off = ppVar11->off + 2;
                                    iVar25 = ptls_buffer_reserve(emitter->buf,0x20);
                                    if (iVar25 == 0) {
                                      puVar32 = emitter->buf->base;
                                      sVar49 = emitter->buf->off;
                                      puVar60 = puVar32 + sVar49 + 0x10;
                                      puVar60[0] = 0xc2;
                                      puVar60[1] = 0xa2;
                                      puVar60[2] = '\x11';
                                      puVar60[3] = '\x16';
                                      puVar60[4] = 'z';
                                      puVar60[5] = 0xbb;
                                      puVar60[6] = 0x8c;
                                      puVar60[7] = '^';
                                      puVar60[8] = '\a';
                                      puVar60[9] = 0x9e;
                                      puVar60[10] = '\t';
                                      puVar60[0xb] = 0xe2;
                                      puVar60[0xc] = 200;
                                      puVar60[0xd] = 0xa8;
                                      puVar60[0xe] = '3';
                                      puVar60[0xf] = 0x9c;
                                      puVar32 = puVar32 + sVar49;
                                      puVar32[0] = 0xcf;
                                      puVar32[1] = '!';
                                      puVar32[2] = 0xad;
                                      puVar32[3] = 't';
                                      puVar32[4] = 0xe5;
                                      puVar32[5] = 0x9a;
                                      puVar32[6] = 'a';
                                      puVar32[7] = '\x11';
                                      puVar32[8] = 0xbe;
                                      puVar32[9] = '\x1d';
                                      puVar32[10] = 0x8c;
                                      puVar32[0xb] = '\x02';
                                      puVar32[0xc] = '\x1e';
                                      puVar32[0xd] = 'e';
                                      puVar32[0xe] = 0xb8;
                                      puVar32[0xf] = 0x91;
                                      ppVar11 = emitter->buf;
                                      ppVar11->off = ppVar11->off + 0x20;
                                      iVar25 = ptls_buffer_reserve(ppVar11,1);
                                      if (iVar25 == 0) {
                                        ppVar11->base[ppVar11->off] = '\0';
                                        ppVar11->off = ppVar11->off + 1;
                                        sVar49 = emitter->buf->off;
                                        iVar25 = ptls_buffer__do_pushv
                                                           (emitter->buf,
                                                            local_518.legacy_session_id.base,
                                                            local_518.legacy_session_id.len);
                                        if (iVar25 == 0) {
                                          emitter->buf->base[sVar49 - 1] =
                                               (char)(int)emitter->buf->off - (char)sVar49;
                                          uVar5 = tls->cipher_suite->id;
                                          ppVar11 = emitter->buf;
                                          iVar25 = ptls_buffer_reserve(ppVar11,2);
                                          if (iVar25 == 0) {
                                            *(ushort *)(ppVar11->base + ppVar11->off) =
                                                 uVar5 << 8 | uVar5 >> 8;
                                            ppVar11->off = ppVar11->off + 2;
                                            ppVar11 = emitter->buf;
                                            iVar25 = ptls_buffer_reserve(ppVar11,1);
                                            if (iVar25 == 0) {
                                              ppVar11->base[ppVar11->off] = '\0';
                                              ppVar11->off = ppVar11->off + 1;
                                              ppVar11 = emitter->buf;
                                              iVar25 = ptls_buffer_reserve(ppVar11,2);
                                              if (iVar25 == 0) {
                                                puVar32 = ppVar11->base;
                                                sVar49 = ppVar11->off;
                                                (puVar32 + sVar49)[0] = '\0';
                                                (puVar32 + sVar49)[1] = '\0';
                                                ppVar11->off = ppVar11->off + 2;
                                                ppVar11 = emitter->buf;
                                                sVar49 = ppVar11->off;
                                                iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                if (iVar25 == 0) {
                                                  puVar32 = ppVar11->base;
                                                  sVar63 = ppVar11->off;
                                                  (puVar32 + sVar63)[0] = '\0';
                                                  (puVar32 + sVar63)[1] = '+';
                                                  ppVar11->off = ppVar11->off + 2;
                                                  ppVar11 = emitter->buf;
                                                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                  uVar22 = local_518.selected_version;
                                                  if (iVar25 == 0) {
                                                    puVar32 = ppVar11->base;
                                                    sVar63 = ppVar11->off;
                                                    (puVar32 + sVar63)[0] = '\0';
                                                    (puVar32 + sVar63)[1] = '\0';
                                                    ppVar11->off = ppVar11->off + 2;
                                                    ppVar11 = emitter->buf;
                                                    sVar63 = ppVar11->off;
                                                    iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                    puVar32 = local_5a8.server_name.base;
                                                    if (iVar25 == 0) {
                                                      *(uint16_t *)(ppVar11->base + ppVar11->off) =
                                                           uVar22 << 8 | uVar22 >> 8;
                                                      ppVar11->off = ppVar11->off + 2;
                                                      lVar47 = emitter->buf->off - sVar63;
                                                      emitter->buf->base[sVar63 - 2] =
                                                           (uint8_t)((ulong)lVar47 >> 8);
                                                      emitter->buf->base[sVar63 - 1] =
                                                           (uint8_t)lVar47;
                                                      if ((ptls_key_exchange_algorithm_t *)
                                                          local_5a8.server_name.base !=
                                                          (ptls_key_exchange_algorithm_t *)0x0 &&
                                                          ppVar61 ==
                                                          (ptls_key_exchange_algorithm_t *)0x0) {
                                                        ppVar11 = emitter->buf;
                                                        iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                        if (iVar25 != 0) goto LAB_0011d0e4;
                                                        puVar60 = ppVar11->base;
                                                        sVar63 = ppVar11->off;
                                                        (puVar60 + sVar63)[0] = '\0';
                                                        (puVar60 + sVar63)[1] = '3';
                                                        ppVar11->off = ppVar11->off + 2;
                                                        ppVar11 = emitter->buf;
                                                        iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                        if (iVar25 != 0) goto LAB_0011d0e4;
                                                        puVar60 = ppVar11->base;
                                                        sVar63 = ppVar11->off;
                                                        (puVar60 + sVar63)[0] = '\0';
                                                        (puVar60 + sVar63)[1] = '\0';
                                                        ppVar11->off = ppVar11->off + 2;
                                                        ppVar11 = emitter->buf;
                                                        sVar63 = ppVar11->off;
                                                        uVar5 = *(uint16_t *)puVar32;
                                                        iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                        if (iVar25 != 0) goto LAB_0011d0e4;
                                                        *(ushort *)(ppVar11->base + ppVar11->off) =
                                                             uVar5 << 8 | uVar5 >> 8;
                                                        ppVar11->off = ppVar11->off + 2;
                                                        lVar47 = emitter->buf->off - sVar63;
                                                        emitter->buf->base[sVar63 - 2] =
                                                             (uint8_t)((ulong)lVar47 >> 8);
                                                        emitter->buf->base[sVar63 - 1] =
                                                             (uint8_t)lVar47;
                                                      }
                                                      lVar47 = emitter->buf->off - sVar49;
                                                      emitter->buf->base[sVar49 - 2] =
                                                           (uint8_t)((ulong)lVar47 >> 8);
                                                      emitter->buf->base[sVar49 - 1] =
                                                           (uint8_t)lVar47;
                                                      sVar49 = ppVar10->off;
                                                      lVar47 = 0x10;
                                                      do {
                                                        ppVar10->base[(long)local_630] =
                                                             (uint8_t)(sVar49 - sVar34 >>
                                                                      ((byte)lVar47 & 0x3f));
                                                        lVar47 = lVar47 + -8;
                                                        local_630 = (ptls_key_schedule_t *)
                                                                    ((long)local_630 + 1);
                                                      } while (lVar47 != -8);
                                                      if ((ppVar31 != (ptls_key_schedule_t *)0x0) &&
                                                         (ppVar31->num_hashes != 0)) {
                                                        puVar32 = ppVar10->base;
                                                        sVar34 = ppVar10->off;
                                                        pppVar50 = &ppVar31->hashes[0].ctx;
                                                        sVar49 = 0;
                                                        do {
                                                          (*(*pppVar50)->update)
                                                                    (*pppVar50,puVar32 + sVar64,
                                                                     sVar34 - sVar64);
                                                          sVar49 = sVar49 + 1;
                                                          pppVar50 = pppVar50 + 2;
                                                        } while (sVar49 != ppVar31->num_hashes);
                                                      }
                                                      iVar25 = (*emitter->commit_message)(emitter);
                                                      if ((iVar25 == 0) &&
                                                         (iVar25 = push_change_cipher_spec
                                                                             (tls,emitter),
                                                         iVar25 == 0)) {
                                                        tls->state = 
                                                  PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                                                  iVar25 = 0x202;
                                                  if (local_518.psk.early_data_indication != 0) {
                                                    (tls->field_18).server.early_data_skipped_bytes
                                                         = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          else {
                            iVar25 = (*emitter->begin_message)(emitter);
                            if (iVar25 == 0) {
                              ppVar10 = emitter->buf;
                              iVar25 = ptls_buffer_reserve(ppVar10,1);
                              if (iVar25 == 0) {
                                ppVar10->base[ppVar10->off] = '\x02';
                                ppVar10->off = ppVar10->off + 1;
                                iVar25 = ptls_buffer_reserve(ppVar10,3);
                                if (iVar25 == 0) {
                                  puVar32 = ppVar10->base;
                                  sVar64 = ppVar10->off;
                                  puVar32[sVar64 + 2] = '\0';
                                  puVar32 = puVar32 + sVar64;
                                  puVar32[0] = '\0';
                                  puVar32[1] = '\0';
                                  local_630 = (ptls_key_schedule_t *)ppVar10->off;
                                  sVar64 = (long)local_630 + 3;
                                  ppVar10->off = sVar64;
                                  ppVar11 = emitter->buf;
                                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                                  if (iVar25 == 0) {
                                    puVar32 = ppVar11->base;
                                    sVar34 = ppVar11->off;
                                    (puVar32 + sVar34)[0] = '\x03';
                                    (puVar32 + sVar34)[1] = '\x03';
                                    ppVar11->off = ppVar11->off + 2;
                                    iVar25 = ptls_buffer_reserve(emitter->buf,0x20);
                                    if (iVar25 == 0) {
                                      puVar32 = emitter->buf->base;
                                      sVar34 = emitter->buf->off;
                                      puVar60 = puVar32 + sVar34 + 0x10;
                                      puVar60[0] = 0xc2;
                                      puVar60[1] = 0xa2;
                                      puVar60[2] = '\x11';
                                      puVar60[3] = '\x16';
                                      puVar60[4] = 'z';
                                      puVar60[5] = 0xbb;
                                      puVar60[6] = 0x8c;
                                      puVar60[7] = '^';
                                      puVar60[8] = '\a';
                                      puVar60[9] = 0x9e;
                                      puVar60[10] = '\t';
                                      puVar60[0xb] = 0xe2;
                                      puVar60[0xc] = 200;
                                      puVar60[0xd] = 0xa8;
                                      puVar60[0xe] = '3';
                                      puVar60[0xf] = 0x9c;
                                      puVar32 = puVar32 + sVar34;
                                      puVar32[0] = 0xcf;
                                      puVar32[1] = '!';
                                      puVar32[2] = 0xad;
                                      puVar32[3] = 't';
                                      puVar32[4] = 0xe5;
                                      puVar32[5] = 0x9a;
                                      puVar32[6] = 'a';
                                      puVar32[7] = '\x11';
                                      puVar32[8] = 0xbe;
                                      puVar32[9] = '\x1d';
                                      puVar32[10] = 0x8c;
                                      puVar32[0xb] = '\x02';
                                      puVar32[0xc] = '\x1e';
                                      puVar32[0xd] = 'e';
                                      puVar32[0xe] = 0xb8;
                                      puVar32[0xf] = 0x91;
                                      ppVar11 = emitter->buf;
                                      ppVar11->off = ppVar11->off + 0x20;
                                      iVar25 = ptls_buffer_reserve(ppVar11,1);
                                      if (iVar25 == 0) {
                                        ppVar11->base[ppVar11->off] = '\0';
                                        ppVar11->off = ppVar11->off + 1;
                                        sVar34 = emitter->buf->off;
                                        iVar25 = ptls_buffer__do_pushv
                                                           (emitter->buf,
                                                            local_518.legacy_session_id.base,
                                                            local_518.legacy_session_id.len);
                                        if (iVar25 == 0) {
                                          emitter->buf->base[sVar34 - 1] =
                                               (char)(int)emitter->buf->off - (char)sVar34;
                                          uVar5 = tls->cipher_suite->id;
                                          ppVar11 = emitter->buf;
                                          iVar25 = ptls_buffer_reserve(ppVar11,2);
                                          if (iVar25 == 0) {
                                            *(ushort *)(ppVar11->base + ppVar11->off) =
                                                 uVar5 << 8 | uVar5 >> 8;
                                            ppVar11->off = ppVar11->off + 2;
                                            ppVar11 = emitter->buf;
                                            iVar25 = ptls_buffer_reserve(ppVar11,1);
                                            if (iVar25 == 0) {
                                              ppVar11->base[ppVar11->off] = '\0';
                                              ppVar11->off = ppVar11->off + 1;
                                              ppVar11 = emitter->buf;
                                              iVar25 = ptls_buffer_reserve(ppVar11,2);
                                              if (iVar25 == 0) {
                                                puVar32 = ppVar11->base;
                                                sVar34 = ppVar11->off;
                                                (puVar32 + sVar34)[0] = '\0';
                                                (puVar32 + sVar34)[1] = '\0';
                                                ppVar11->off = ppVar11->off + 2;
                                                ppVar11 = emitter->buf;
                                                sVar34 = ppVar11->off;
                                                iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                if (iVar25 == 0) {
                                                  puVar32 = ppVar11->base;
                                                  sVar49 = ppVar11->off;
                                                  (puVar32 + sVar49)[0] = '\0';
                                                  (puVar32 + sVar49)[1] = '+';
                                                  ppVar11->off = ppVar11->off + 2;
                                                  ppVar11 = emitter->buf;
                                                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                  uVar22 = local_518.selected_version;
                                                  if (iVar25 == 0) {
                                                    puVar32 = ppVar11->base;
                                                    sVar49 = ppVar11->off;
                                                    (puVar32 + sVar49)[0] = '\0';
                                                    (puVar32 + sVar49)[1] = '\0';
                                                    ppVar11->off = ppVar11->off + 2;
                                                    ppVar11 = emitter->buf;
                                                    sVar49 = ppVar11->off;
                                                    iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                    puVar32 = local_5a8.server_name.base;
                                                    if (iVar25 == 0) {
                                                      *(uint16_t *)(ppVar11->base + ppVar11->off) =
                                                           uVar22 << 8 | uVar22 >> 8;
                                                      ppVar11->off = ppVar11->off + 2;
                                                      lVar47 = emitter->buf->off - sVar49;
                                                      emitter->buf->base[sVar49 - 2] =
                                                           (uint8_t)((ulong)lVar47 >> 8);
                                                      emitter->buf->base[sVar49 - 1] =
                                                           (uint8_t)lVar47;
                                                      if ((ptls_key_exchange_algorithm_t *)
                                                          local_5a8.server_name.base !=
                                                          (ptls_key_exchange_algorithm_t *)0x0 &&
                                                          ppVar61 ==
                                                          (ptls_key_exchange_algorithm_t *)0x0) {
                                                        ppVar11 = emitter->buf;
                                                        iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                        if (iVar25 != 0) goto LAB_0011d0e4;
                                                        puVar60 = ppVar11->base;
                                                        sVar49 = ppVar11->off;
                                                        (puVar60 + sVar49)[0] = '\0';
                                                        (puVar60 + sVar49)[1] = '3';
                                                        ppVar11->off = ppVar11->off + 2;
                                                        ppVar11 = emitter->buf;
                                                        iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                        if (iVar25 != 0) goto LAB_0011d0e4;
                                                        puVar60 = ppVar11->base;
                                                        sVar49 = ppVar11->off;
                                                        (puVar60 + sVar49)[0] = '\0';
                                                        (puVar60 + sVar49)[1] = '\0';
                                                        ppVar11->off = ppVar11->off + 2;
                                                        ppVar11 = emitter->buf;
                                                        sVar49 = ppVar11->off;
                                                        uVar5 = *(uint16_t *)puVar32;
                                                        iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                        if (iVar25 != 0) goto LAB_0011d0e4;
                                                        *(ushort *)(ppVar11->base + ppVar11->off) =
                                                             uVar5 << 8 | uVar5 >> 8;
                                                        ppVar11->off = ppVar11->off + 2;
                                                        lVar47 = emitter->buf->off - sVar49;
                                                        emitter->buf->base[sVar49 - 2] =
                                                             (uint8_t)((ulong)lVar47 >> 8);
                                                        emitter->buf->base[sVar49 - 1] =
                                                             (uint8_t)lVar47;
                                                      }
                                                      ppVar11 = emitter->buf;
                                                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                      if (iVar25 == 0) {
                                                        puVar60 = ppVar11->base;
                                                        sVar49 = ppVar11->off;
                                                        (puVar60 + sVar49)[0] = '\0';
                                                        (puVar60 + sVar49)[1] = ',';
                                                        ppVar11->off = ppVar11->off + 2;
                                                        iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                        if (iVar25 == 0) {
                                                          puVar60 = ppVar11->base;
                                                          sVar49 = ppVar11->off;
                                                          (puVar60 + sVar49)[0] = '\0';
                                                          (puVar60 + sVar49)[1] = '\0';
                                                          sVar49 = ppVar11->off;
                                                          ppVar11->off = sVar49 + 2;
                                                          iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                          if (iVar25 == 0) {
                                                            puVar60 = ppVar11->base;
                                                            sVar63 = ppVar11->off;
                                                            (puVar60 + sVar63)[0] = '\0';
                                                            (puVar60 + sVar63)[1] = '\0';
                                                            sVar63 = ppVar11->off;
                                                            sVar35 = sVar63 + 2;
                                                            ppVar11->off = sVar35;
                                                            iVar25 = ptls_buffer_reserve(ppVar11,2);
                                                            if (iVar25 == 0) {
                                                              puVar60 = ppVar11->base;
                                                              sVar15 = ppVar11->off;
                                                              (puVar60 + sVar15)[0] = '\0';
                                                              (puVar60 + sVar15)[1] = '\0';
                                                              sVar15 = ppVar11->off;
                                                              ppVar11->off = sVar15 + 2;
                                                              iVar25 = ptls_buffer_reserve(ppVar11,1
                                                                                          );
                                                              if (iVar25 == 0) {
                                                                ppVar11->base[ppVar11->off] = '\0';
                                                                sVar66 = ppVar11->off;
                                                                sVar33 = sVar66 + 1;
                                                                ppVar11->off = sVar33;
                                                                local_528 = tls->cipher_suite->hash
                                                                            ->digest_size;
                                                                iVar25 = ptls_buffer_reserve(ppVar11
                                                  ,local_528);
                                                  if (iVar25 == 0) {
                                                    psVar12 = tls->key_schedule->hashes[0].ctx;
                                                    (*psVar12->final)(psVar12,ppVar11->base +
                                                                              ppVar11->off,
                                                                      PTLS_HASH_FINAL_MODE_RESET);
                                                    sVar48 = local_528 + ppVar11->off;
                                                    ppVar11->off = sVar48;
                                                    ppVar11->base[sVar66] =
                                                         (char)sVar48 - (char)sVar33;
                                                    iVar25 = ptls_buffer_reserve(ppVar11,1);
                                                    if (iVar25 == 0) {
                                                      ppVar11->base[ppVar11->off] =
                                                           ppVar61 ==
                                                           (ptls_key_exchange_algorithm_t *)0x0;
                                                      sVar66 = ppVar11->off + 1;
                                                      ppVar11->off = sVar66;
                                                      lVar47 = sVar66 - (sVar15 + 2);
                                                      ppVar11->base[sVar15] =
                                                           (uint8_t)((ulong)lVar47 >> 8);
                                                      ppVar11->base[sVar15 + 1] = (uint8_t)lVar47;
                                                      sVar15 = ppVar11->off;
                                                      iVar25 = ptls_buffer_reserve(ppVar11,1);
                                                      if (iVar25 == 0) {
                                                        ppVar11->base[ppVar11->off] = '\0';
                                                        sVar66 = ppVar11->off;
                                                        sVar48 = sVar66 + 1;
                                                        ppVar11->off = sVar48;
                                                        sVar33 = (*tls->ctx->cipher_suites)->hash->
                                                                 digest_size;
                                                        iVar25 = ptls_buffer_reserve(ppVar11,sVar33)
                                                        ;
                                                        if ((iVar25 == 0) &&
                                                           (tbs_00.len = sVar15 - sVar35,
                                                           tbs_00.base = ppVar11->base + sVar35,
                                                           iVar25 = calc_cookie_signature
                                                                              (tls,properties,
                                                                               (
                                                  ptls_key_exchange_algorithm_t *)puVar32,tbs_00,
                                                  ppVar11->base + ppVar11->off), iVar25 == 0)) {
                                                    sVar33 = sVar33 + ppVar11->off;
                                                    ppVar11->off = sVar33;
                                                    ppVar11->base[sVar66] =
                                                         (char)sVar33 - (char)sVar48;
                                                    lVar47 = ppVar11->off - sVar35;
                                                    ppVar11->base[sVar63] =
                                                         (uint8_t)((ulong)lVar47 >> 8);
                                                    ppVar11->base[sVar63 + 1] = (uint8_t)lVar47;
                                                    lVar47 = ppVar11->off - (sVar49 + 2);
                                                    ppVar11->base[sVar49] =
                                                         (uint8_t)((ulong)lVar47 >> 8);
                                                    ppVar11->base[sVar49 + 1] = (uint8_t)lVar47;
                                                    lVar47 = emitter->buf->off - sVar34;
                                                    emitter->buf->base[sVar34 - 2] =
                                                         (uint8_t)((ulong)lVar47 >> 8);
                                                    emitter->buf->base[sVar34 - 1] = (uint8_t)lVar47
                                                    ;
                                                    sVar34 = ppVar10->off;
                                                    lVar47 = 0x10;
                                                    do {
                                                      ppVar10->base[(long)local_630] =
                                                           (uint8_t)(sVar34 - sVar64 >>
                                                                    ((byte)lVar47 & 0x3f));
                                                      lVar47 = lVar47 + -8;
                                                      local_630 = (ptls_key_schedule_t *)
                                                                  ((long)local_630 + 1);
                                                    } while (lVar47 != -8);
                                                    iVar25 = (*emitter->commit_message)(emitter);
                                                    if (iVar25 == 0) {
                                                      iVar24 = push_change_cipher_spec(tls,emitter);
                                                      iVar25 = 0x206;
                                                      if (iVar24 != 0) {
                                                        iVar25 = iVar24;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      goto LAB_0011d0e4;
                    }
                    bVar67 = true;
                    if ((properties != (ptls_handshake_properties_t *)0x0) &&
                       (bVar67 = true, (*(byte *)((long)&properties->field_0 + 0x60) & 1) != 0))
                    goto LAB_0011e79a;
                  }
                  iVar25 = report_unknown_extensions(tls,properties,local_518.unknown_extensions);
                  if ((iVar25 != 0) ||
                     (((((bool)((ptls_key_exchange_algorithm_t *)local_518.psk.hash_end !=
                                (ptls_key_exchange_algorithm_t *)0x0 & bVar67) &&
                        ((local_518.psk.ke_modes & 3) != 0)) &&
                       (tls->ctx->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0)) &&
                      (((tls->ctx->field_0x70 & 8) == 0 &&
                       (ch_trunc.len = (long)local_518.psk.hash_end - (long)puVar32,
                       ch_trunc.base = puVar32,
                       iVar25 = try_psk_handshake(tls,&local_540,&local_5dc,&local_518,ch_trunc),
                       iVar25 != 0)))))) goto LAB_0011d0e4;
                  puVar60 = local_518.psk.hash_end;
                  sVar64 = local_540;
                  if ((local_540 == 0xffffffffffffffff) || ((tls->ctx->field_0x70 & 8) != 0)) {
                    ppVar31 = tls->key_schedule;
                    if (ppVar31->num_hashes != 0) {
                      pppVar50 = &ppVar31->hashes[0].ctx;
                      sVar34 = 0;
                      do {
                        (*(*pppVar50)->update)(*pppVar50,puVar32,uVar37);
                        sVar34 = sVar34 + 1;
                        pppVar50 = pppVar50 + 2;
                      } while (sVar34 != ppVar31->num_hashes);
                    }
                    if (bVar67) {
                      if (tls->key_schedule->generation != 0) {
                        __assert_fail("tls->key_schedule->generation == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                                      ,0xf0e,
                                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                     );
                      }
                      key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
                    }
                    iVar24 = 0;
                    if (properties != (ptls_handshake_properties_t *)0x0) {
                      sVar28 = 0;
                      iVar24 = 0;
                      goto LAB_0011ec7b;
                    }
                  }
                  else {
                    ppVar31 = tls->key_schedule;
                    if (ppVar31->num_hashes != 0) {
                      sVar34 = (long)ppVar1 - (long)local_518.psk.hash_end;
                      pppVar50 = &ppVar31->hashes[0].ctx;
                      sVar49 = 0;
                      do {
                        (*(*pppVar50)->update)(*pppVar50,puVar60,sVar34);
                        sVar49 = sVar49 + 1;
                        pppVar50 = pppVar50 + 2;
                      } while (sVar49 != ppVar31->num_hashes);
                    }
                    iVar24 = 1;
                    if (((local_518.psk.ke_modes & 1) == 0) &&
                       (iVar24 = 2, (local_518.psk.ke_modes & 2) == 0)) {
                      __assert_fail("(ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                                    ,0xf19,
                                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                   );
                    }
                    tls->field_0x160 = tls->field_0x160 | 2;
                    if (properties != (ptls_handshake_properties_t *)0x0) {
                      sVar28 = local_518.psk.identities.list[sVar64].binder.len;
                      memcpy(properties,local_518.psk.identities.list[sVar64].binder.base,sVar28);
LAB_0011ec7b:
                      *(size_t *)((long)&properties->field_0 + 0x40) = sVar28;
                    }
                  }
                  if (((local_5dc != 0) && (sVar64 == 0)) && (tls->ctx->max_early_data_size != 0)) {
                    puVar32 = (uint8_t *)malloc(0x40);
                    tls->pending_handshake_secret = puVar32;
                    if (puVar32 == (uint8_t *)0x0) {
LAB_0011f09f:
                      iVar25 = 0x201;
                      goto LAB_0011d0e4;
                    }
                    iVar25 = derive_exporter_secret(tls,1);
                    if ((iVar25 != 0) ||
                       (iVar25 = setup_traffic_protection(tls,0,"c e traffic",1,0), iVar25 != 0))
                    goto LAB_0011d0e4;
                  }
                  ppVar1 = local_5c8;
                  if (iVar24 != 1) {
                    if (local_5c8 == (st_ptls_key_exchange_algorithm_t *)0x0) {
                      iVar25 = 0x28;
                      if ((ushort *)local_518.key_shares.base == (ushort *)0x0) {
                        iVar25 = 0x6d;
                      }
                      goto LAB_0011d0e4;
                    }
                    pVar21.len = pStack_5c0.len;
                    pVar21.base = pStack_5c0.base;
                    iVar25 = (*local_5c8->exchange)(local_5c8,&local_538,&local_5d8,pVar21);
                    if (iVar25 != 0) goto LAB_0011d0e4;
                    tls->key_share = ppVar1;
                  }
                  iVar25 = (*emitter->begin_message)(emitter);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  ppVar10 = emitter->buf;
                  ppVar31 = tls->key_schedule;
                  sVar34 = ppVar10->off;
                  iVar25 = ptls_buffer_reserve(ppVar10,1);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  ppVar10->base[ppVar10->off] = '\x02';
                  ppVar10->off = ppVar10->off + 1;
                  iVar25 = ptls_buffer_reserve(ppVar10,3);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  puVar32 = ppVar10->base;
                  sVar49 = ppVar10->off;
                  puVar32[sVar49 + 2] = '\0';
                  puVar32 = puVar32 + sVar49;
                  puVar32[0] = '\0';
                  puVar32[1] = '\0';
                  local_620 = ppVar10->off;
                  sVar49 = local_620 + 3;
                  ppVar10->off = sVar49;
                  ppVar11 = emitter->buf;
                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  puVar32 = ppVar11->base;
                  sVar63 = ppVar11->off;
                  (puVar32 + sVar63)[0] = '\x03';
                  (puVar32 + sVar63)[1] = '\x03';
                  ppVar11->off = ppVar11->off + 2;
                  iVar25 = ptls_buffer_reserve(emitter->buf,0x20);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  (*tls->ctx->random_bytes)(emitter->buf->base + emitter->buf->off,0x20);
                  ppVar11 = emitter->buf;
                  ppVar11->off = ppVar11->off + 0x20;
                  iVar25 = ptls_buffer_reserve(ppVar11,1);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  ppVar11->base[ppVar11->off] = '\0';
                  ppVar11->off = ppVar11->off + 1;
                  sVar63 = emitter->buf->off;
                  iVar25 = ptls_buffer__do_pushv
                                     (emitter->buf,local_518.legacy_session_id.base,
                                      local_518.legacy_session_id.len);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  emitter->buf->base[sVar63 - 1] = (char)(int)emitter->buf->off - (char)sVar63;
                  uVar5 = tls->cipher_suite->id;
                  ppVar11 = emitter->buf;
                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  *(ushort *)(ppVar11->base + ppVar11->off) = uVar5 << 8 | uVar5 >> 8;
                  ppVar11->off = ppVar11->off + 2;
                  ppVar11 = emitter->buf;
                  iVar25 = ptls_buffer_reserve(ppVar11,1);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  ppVar11->base[ppVar11->off] = '\0';
                  ppVar11->off = ppVar11->off + 1;
                  ppVar11 = emitter->buf;
                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  puVar32 = ppVar11->base;
                  sVar63 = ppVar11->off;
                  (puVar32 + sVar63)[0] = '\0';
                  (puVar32 + sVar63)[1] = '\0';
                  ppVar11->off = ppVar11->off + 2;
                  ppVar11 = emitter->buf;
                  sVar63 = ppVar11->off;
                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  puVar32 = ppVar11->base;
                  sVar35 = ppVar11->off;
                  (puVar32 + sVar35)[0] = '\0';
                  (puVar32 + sVar35)[1] = '+';
                  ppVar11->off = ppVar11->off + 2;
                  ppVar11 = emitter->buf;
                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                  uVar22 = local_518.selected_version;
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  puVar32 = ppVar11->base;
                  sVar35 = ppVar11->off;
                  (puVar32 + sVar35)[0] = '\0';
                  (puVar32 + sVar35)[1] = '\0';
                  ppVar11->off = ppVar11->off + 2;
                  ppVar11 = emitter->buf;
                  sVar35 = ppVar11->off;
                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                  if (iVar25 != 0) goto LAB_0011d0e4;
                  *(uint16_t *)(ppVar11->base + ppVar11->off) = uVar22 << 8 | uVar22 >> 8;
                  ppVar11->off = ppVar11->off + 2;
                  lVar47 = emitter->buf->off - sVar35;
                  emitter->buf->base[sVar35 - 2] = (uint8_t)((ulong)lVar47 >> 8);
                  emitter->buf->base[sVar35 - 1] = (uint8_t)lVar47;
                  ppVar11 = emitter->buf;
                  if (iVar24 == 1) {
LAB_0011efe9:
                    iVar25 = ptls_buffer_reserve(ppVar11,2);
                    if (iVar25 != 0) goto LAB_0011d0e4;
                    puVar32 = ppVar11->base;
                    sVar35 = ppVar11->off;
                    (puVar32 + sVar35)[0] = '\0';
                    (puVar32 + sVar35)[1] = ')';
                    ppVar11->off = ppVar11->off + 2;
                    iVar25 = ptls_buffer_reserve(ppVar11,2);
                    if (iVar25 != 0) goto LAB_0011d0e4;
                    puVar32 = ppVar11->base;
                    sVar35 = ppVar11->off;
                    (puVar32 + sVar35)[0] = '\0';
                    (puVar32 + sVar35)[1] = '\0';
                    sVar35 = ppVar11->off;
                    ppVar11->off = sVar35 + 2;
                    iVar25 = ptls_buffer_reserve(ppVar11,2);
                    if (iVar25 != 0) goto LAB_0011d0e4;
                    *(ushort *)(ppVar11->base + ppVar11->off) =
                         (ushort)sVar64 << 8 | (ushort)sVar64 >> 8;
                    sVar64 = ppVar11->off;
                    ppVar11->off = sVar64 + 2;
                    lVar47 = sVar64 - sVar35;
                    ppVar11->base[sVar35] = (uint8_t)((ulong)lVar47 >> 8);
                    ppVar11->base[sVar35 + 1] = (uint8_t)lVar47;
                  }
                  else {
                    iVar25 = ptls_buffer_reserve(ppVar11,2);
                    if (iVar25 != 0) goto LAB_0011d0e4;
                    puVar32 = ppVar11->base;
                    sVar35 = ppVar11->off;
                    (puVar32 + sVar35)[0] = '\0';
                    (puVar32 + sVar35)[1] = '3';
                    ppVar11->off = ppVar11->off + 2;
                    iVar25 = ptls_buffer_reserve(ppVar11,2);
                    if (iVar25 != 0) goto LAB_0011d0e4;
                    puVar32 = ppVar11->base;
                    sVar35 = ppVar11->off;
                    (puVar32 + sVar35)[0] = '\0';
                    (puVar32 + sVar35)[1] = '\0';
                    sVar35 = ppVar11->off;
                    ppVar11->off = sVar35 + 2;
                    uVar5 = local_5c8->id;
                    iVar25 = ptls_buffer_reserve(ppVar11,2);
                    if (iVar25 != 0) goto LAB_0011d0e4;
                    *(ushort *)(ppVar11->base + ppVar11->off) = uVar5 << 8 | uVar5 >> 8;
                    ppVar11->off = ppVar11->off + 2;
                    iVar25 = ptls_buffer_reserve(ppVar11,2);
                    if (iVar25 != 0) goto LAB_0011d0e4;
                    puVar32 = ppVar11->base;
                    sVar15 = ppVar11->off;
                    (puVar32 + sVar15)[0] = '\0';
                    (puVar32 + sVar15)[1] = '\0';
                    sVar15 = ppVar11->off;
                    ppVar11->off = sVar15 + 2;
                    iVar25 = ptls_buffer__do_pushv(ppVar11,local_538.base,local_538.len);
                    if (iVar25 != 0) goto LAB_0011d0e4;
                    lVar47 = ppVar11->off - (sVar15 + 2);
                    ppVar11->base[sVar15] = (uint8_t)((ulong)lVar47 >> 8);
                    ppVar11->base[sVar15 + 1] = (uint8_t)lVar47;
                    lVar47 = ppVar11->off - (sVar35 + 2);
                    ppVar11->base[sVar35] = (uint8_t)((ulong)lVar47 >> 8);
                    ppVar11->base[sVar35 + 1] = (uint8_t)lVar47;
                    if (iVar24 != 0) goto LAB_0011efe9;
                  }
                  lVar47 = emitter->buf->off - sVar63;
                  emitter->buf->base[sVar63 - 2] = (uint8_t)((ulong)lVar47 >> 8);
                  emitter->buf->base[sVar63 - 1] = (uint8_t)lVar47;
                  sVar64 = ppVar10->off;
                  lVar47 = 0x10;
                  do {
                    ppVar10->base[local_620] = (uint8_t)(sVar64 - sVar49 >> ((byte)lVar47 & 0x3f));
                    lVar47 = lVar47 + -8;
                    local_620 = local_620 + 1;
                  } while (lVar47 != -8);
                  if ((ppVar31 != (ptls_key_schedule_t *)0x0) && (ppVar31->num_hashes != 0)) {
                    puVar32 = ppVar10->base;
                    sVar64 = ppVar10->off;
                    pppVar50 = &ppVar31->hashes[0].ctx;
                    sVar49 = 0;
                    do {
                      (*(*pppVar50)->update)(*pppVar50,puVar32 + sVar34,sVar64 - sVar34);
                      sVar49 = sVar49 + 1;
                      pppVar50 = pppVar50 + 2;
                    } while (sVar49 != ppVar31->num_hashes);
                  }
                  iVar25 = (*emitter->commit_message)(emitter);
                  if ((iVar25 == 0) && (iVar25 = push_change_cipher_spec(tls,emitter), iVar25 == 0))
                  {
                    if (tls->key_schedule->generation != 1) {
                      __assert_fail("tls->key_schedule->generation == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                                    ,0xf4e,
                                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                   );
                    }
                    ikm.len = local_5d8.len;
                    ikm.base = local_5d8.base;
                    key_schedule_extract(tls->key_schedule,ikm);
                    iVar25 = setup_traffic_protection(tls,1,"s hs traffic",2,0);
                    if (iVar25 == 0) {
                      if (tls->pending_handshake_secret == (uint8_t *)0x0) {
                        iVar25 = setup_traffic_protection(tls,0,"c hs traffic",2,0);
                        if (iVar25 != 0) goto LAB_0011d0e4;
                        if (local_518.psk.early_data_indication != 0) {
                          (tls->field_18).server.early_data_skipped_bytes = 0;
                        }
                      }
                      else {
                        iVar25 = derive_secret(tls->key_schedule,tls->pending_handshake_secret,
                                               "c hs traffic");
                        if ((iVar25 != 0) ||
                           ((psVar14 = tls->ctx->update_traffic_key,
                            psVar14 != (st_ptls_update_traffic_key_t *)0x0 &&
                            (iVar25 = (*psVar14->cb)(psVar14,tls,0,2,tls->pending_handshake_secret),
                            iVar25 != 0)))) goto LAB_0011d0e4;
                      }
                      iVar25 = (*emitter->begin_message)(emitter);
                      if (iVar25 == 0) {
                        ppVar10 = emitter->buf;
                        ppVar31 = tls->key_schedule;
                        sVar64 = ppVar10->off;
                        iVar25 = ptls_buffer_reserve(ppVar10,1);
                        if (iVar25 == 0) {
                          ppVar10->base[ppVar10->off] = '\b';
                          ppVar10->off = ppVar10->off + 1;
                          iVar25 = ptls_buffer_reserve(ppVar10,3);
                          if (iVar25 == 0) {
                            puVar32 = ppVar10->base;
                            sVar34 = ppVar10->off;
                            puVar32[sVar34 + 2] = '\0';
                            puVar32 = puVar32 + sVar34;
                            puVar32[0] = '\0';
                            puVar32[1] = '\0';
                            local_628 = (st_ptls_key_exchange_context_t **)ppVar10->off;
                            sVar34 = (long)local_628 + 3;
                            ppVar10->off = sVar34;
                            ppVar11 = emitter->buf;
                            iVar25 = ptls_buffer_reserve(ppVar11,2);
                            if (iVar25 == 0) {
                              puVar32 = ppVar11->base;
                              sVar49 = ppVar11->off;
                              (puVar32 + sVar49)[0] = '\0';
                              (puVar32 + sVar49)[1] = '\0';
                              sVar49 = ppVar11->off;
                              ppVar11->off = sVar49 + 2;
                              if (tls->esni == (ptls_esni_secret_t *)0x0) {
                                if (tls->server_name != (char *)0x0) {
                                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                                  if (iVar25 != 0) goto LAB_0011d0e4;
                                  puVar32 = ppVar11->base;
                                  sVar63 = ppVar11->off;
                                  (puVar32 + sVar63)[0] = '\0';
                                  (puVar32 + sVar63)[1] = '\0';
                                  ppVar11->off = ppVar11->off + 2;
                                  iVar25 = ptls_buffer_reserve(ppVar11,2);
                                  if (iVar25 != 0) goto LAB_0011d0e4;
                                  puVar32 = ppVar11->base;
                                  sVar63 = ppVar11->off;
                                  (puVar32 + sVar63)[0] = '\0';
                                  (puVar32 + sVar63)[1] = '\0';
                                  sVar63 = ppVar11->off;
                                  ppVar11->off = sVar63 + 2;
                                  ppVar11->base[sVar63] = '\0';
                                  ppVar11->base[sVar63 + 1] = '\0';
                                }
                              }
                              else {
                                iVar25 = ptls_buffer_reserve(ppVar11,2);
                                if (iVar25 != 0) goto LAB_0011d0e4;
                                puVar32 = ppVar11->base;
                                sVar63 = ppVar11->off;
                                (puVar32 + sVar63)[0] = 0xff;
                                (puVar32 + sVar63)[1] = 0xce;
                                ppVar11->off = ppVar11->off + 2;
                                iVar25 = ptls_buffer_reserve(ppVar11,2);
                                if (iVar25 != 0) goto LAB_0011d0e4;
                                puVar32 = ppVar11->base;
                                sVar63 = ppVar11->off;
                                (puVar32 + sVar63)[0] = '\0';
                                (puVar32 + sVar63)[1] = '\0';
                                sVar63 = ppVar11->off;
                                ppVar11->off = sVar63 + 2;
                                iVar25 = ptls_buffer_reserve(ppVar11,1);
                                if (iVar25 != 0) goto LAB_0011d0e4;
                                ppVar11->base[ppVar11->off] = '\0';
                                ppVar11->off = ppVar11->off + 1;
                                ppVar29 = tls->esni;
                                iVar25 = ptls_buffer_reserve(ppVar11,0x10);
                                if (iVar25 != 0) goto LAB_0011d0e4;
                                puVar32 = ppVar11->base;
                                sVar35 = ppVar11->off;
                                uVar17 = *(undefined8 *)(ppVar29->nonce + 8);
                                *(undefined8 *)(puVar32 + sVar35) = *(undefined8 *)ppVar29->nonce;
                                *(undefined8 *)(puVar32 + sVar35 + 8) = uVar17;
                                sVar35 = ppVar11->off + 0x10;
                                ppVar11->off = sVar35;
                                lVar47 = sVar35 - (sVar63 + 2);
                                ppVar11->base[sVar63] = (uint8_t)((ulong)lVar47 >> 8);
                                ppVar11->base[sVar63 + 1] = (uint8_t)lVar47;
                                free_esni_secret(&tls->esni,1);
                              }
                              if (tls->negotiated_protocol != (char *)0x0) {
                                iVar25 = ptls_buffer_reserve(ppVar11,2);
                                if (iVar25 != 0) goto LAB_0011d0e4;
                                puVar32 = ppVar11->base;
                                sVar63 = ppVar11->off;
                                (puVar32 + sVar63)[0] = '\0';
                                (puVar32 + sVar63)[1] = '\x10';
                                ppVar11->off = ppVar11->off + 2;
                                iVar25 = ptls_buffer_reserve(ppVar11,2);
                                if (iVar25 != 0) goto LAB_0011d0e4;
                                puVar32 = ppVar11->base;
                                sVar63 = ppVar11->off;
                                (puVar32 + sVar63)[0] = '\0';
                                (puVar32 + sVar63)[1] = '\0';
                                sVar63 = ppVar11->off;
                                ppVar11->off = sVar63 + 2;
                                iVar25 = ptls_buffer_reserve(ppVar11,2);
                                if (iVar25 != 0) goto LAB_0011d0e4;
                                puVar32 = ppVar11->base;
                                sVar35 = ppVar11->off;
                                (puVar32 + sVar35)[0] = '\0';
                                (puVar32 + sVar35)[1] = '\0';
                                sVar35 = ppVar11->off;
                                ppVar11->off = sVar35 + 2;
                                iVar25 = ptls_buffer_reserve(ppVar11,1);
                                if (iVar25 != 0) goto LAB_0011d0e4;
                                ppVar11->base[ppVar11->off] = '\0';
                                sVar15 = ppVar11->off;
                                sVar66 = sVar15 + 1;
                                ppVar11->off = sVar66;
                                pcVar8 = tls->negotiated_protocol;
                                sVar28 = strlen(pcVar8);
                                iVar25 = ptls_buffer__do_pushv(ppVar11,pcVar8,sVar28);
                                if (iVar25 != 0) goto LAB_0011d0e4;
                                ppVar11->base[sVar15] = (char)(int)ppVar11->off - (char)sVar66;
                                lVar47 = ppVar11->off - (sVar35 + 2);
                                ppVar11->base[sVar35] = (uint8_t)((ulong)lVar47 >> 8);
                                ppVar11->base[sVar35 + 1] = (uint8_t)lVar47;
                                lVar47 = ppVar11->off - (sVar63 + 2);
                                ppVar11->base[sVar63] = (uint8_t)((ulong)lVar47 >> 8);
                                ppVar11->base[sVar63 + 1] = (uint8_t)lVar47;
                              }
                              if (tls->pending_handshake_secret != (uint8_t *)0x0) {
                                iVar25 = ptls_buffer_reserve(ppVar11,2);
                                if (iVar25 != 0) goto LAB_0011d0e4;
                                puVar32 = ppVar11->base;
                                sVar63 = ppVar11->off;
                                (puVar32 + sVar63)[0] = '\0';
                                (puVar32 + sVar63)[1] = '*';
                                ppVar11->off = ppVar11->off + 2;
                                iVar25 = ptls_buffer_reserve(ppVar11,2);
                                if (iVar25 != 0) goto LAB_0011d0e4;
                                puVar32 = ppVar11->base;
                                sVar63 = ppVar11->off;
                                (puVar32 + sVar63)[0] = '\0';
                                (puVar32 + sVar63)[1] = '\0';
                                sVar63 = ppVar11->off;
                                ppVar11->off = sVar63 + 2;
                                ppVar11->base[sVar63] = '\0';
                                ppVar11->base[sVar63 + 1] = '\0';
                              }
                              iVar25 = push_additional_extensions(properties,ppVar11);
                              if (iVar25 == 0) {
                                lVar47 = ppVar11->off - (sVar49 + 2);
                                ppVar11->base[sVar49] = (uint8_t)((ulong)lVar47 >> 8);
                                ppVar11->base[sVar49 + 1] = (uint8_t)lVar47;
                                sVar49 = ppVar10->off;
                                lVar47 = 0x10;
                                do {
                                  ppVar10->base[(long)local_628] =
                                       (uint8_t)(sVar49 - sVar34 >> ((byte)lVar47 & 0x3f));
                                  lVar47 = lVar47 + -8;
                                  local_628 = (st_ptls_key_exchange_context_t **)
                                              ((long)local_628 + 1);
                                } while (lVar47 != -8);
                                if ((ppVar31 != (ptls_key_schedule_t *)0x0) &&
                                   (ppVar31->num_hashes != 0)) {
                                  puVar32 = ppVar10->base;
                                  sVar34 = ppVar10->off;
                                  pppVar50 = &ppVar31->hashes[0].ctx;
                                  sVar49 = 0;
                                  do {
                                    (*(*pppVar50)->update)
                                              (*pppVar50,puVar32 + sVar64,sVar34 - sVar64);
                                    sVar49 = sVar49 + 1;
                                    pppVar50 = pppVar50 + 2;
                                  } while (sVar49 != ppVar31->num_hashes);
                                }
                                iVar25 = (*emitter->commit_message)(emitter);
                                if (iVar25 == 0) {
                                  if (iVar24 == 0) {
                                    if ((tls->ctx->field_0x70 & 8) != 0) {
                                      iVar25 = (*emitter->begin_message)(emitter);
                                      if (iVar25 != 0) goto LAB_0011d0e4;
                                      ppVar10 = emitter->buf;
                                      ppVar31 = tls->key_schedule;
                                      sVar64 = ppVar10->off;
                                      iVar25 = ptls_buffer_reserve(ppVar10,1);
                                      if (iVar25 != 0) goto LAB_0011d0e4;
                                      ppVar10->base[ppVar10->off] = '\r';
                                      ppVar10->off = ppVar10->off + 1;
                                      iVar25 = ptls_buffer_reserve(ppVar10,3);
                                      if (iVar25 != 0) goto LAB_0011d0e4;
                                      puVar32 = ppVar10->base;
                                      sVar34 = ppVar10->off;
                                      puVar32[sVar34 + 2] = '\0';
                                      puVar32 = puVar32 + sVar34;
                                      puVar32[0] = '\0';
                                      puVar32[1] = '\0';
                                      sVar49 = ppVar10->off;
                                      sVar34 = sVar49 + 3;
                                      ppVar10->off = sVar34;
                                      ppVar11 = emitter->buf;
                                      iVar25 = ptls_buffer_reserve(ppVar11,1);
                                      if (iVar25 != 0) goto LAB_0011d0e4;
                                      ppVar11->base[ppVar11->off] = '\0';
                                      ppVar11->off = ppVar11->off + 1;
                                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                                      if (iVar25 != 0) goto LAB_0011d0e4;
                                      puVar32 = ppVar11->base;
                                      sVar63 = ppVar11->off;
                                      (puVar32 + sVar63)[0] = '\0';
                                      (puVar32 + sVar63)[1] = '\0';
                                      sVar63 = ppVar11->off;
                                      ppVar11->off = sVar63 + 2;
                                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                                      if (iVar25 != 0) goto LAB_0011d0e4;
                                      puVar32 = ppVar11->base;
                                      sVar35 = ppVar11->off;
                                      (puVar32 + sVar35)[0] = '\0';
                                      (puVar32 + sVar35)[1] = '\r';
                                      ppVar11->off = ppVar11->off + 2;
                                      iVar25 = ptls_buffer_reserve(ppVar11,2);
                                      if (iVar25 != 0) goto LAB_0011d0e4;
                                      puVar32 = ppVar11->base;
                                      sVar35 = ppVar11->off;
                                      (puVar32 + sVar35)[0] = '\0';
                                      (puVar32 + sVar35)[1] = '\0';
                                      sVar35 = ppVar11->off;
                                      ppVar11->off = sVar35 + 2;
                                      iVar25 = push_signature_algorithms(ppVar11);
                                      if (iVar25 != 0) goto LAB_0011d0e4;
                                      lVar47 = ppVar11->off - (sVar35 + 2);
                                      ppVar11->base[sVar35] = (uint8_t)((ulong)lVar47 >> 8);
                                      ppVar11->base[sVar35 + 1] = (uint8_t)lVar47;
                                      lVar47 = ppVar11->off - (sVar63 + 2);
                                      ppVar11->base[sVar63] = (uint8_t)((ulong)lVar47 >> 8);
                                      ppVar11->base[sVar63 + 1] = (uint8_t)lVar47;
                                      sVar63 = ppVar10->off;
                                      lVar47 = 0x10;
                                      do {
                                        ppVar10->base[sVar49] =
                                             (uint8_t)(sVar63 - sVar34 >> ((byte)lVar47 & 0x3f));
                                        lVar47 = lVar47 + -8;
                                        sVar49 = sVar49 + 1;
                                      } while (lVar47 != -8);
                                      if ((ppVar31 != (ptls_key_schedule_t *)0x0) &&
                                         (ppVar31->num_hashes != 0)) {
                                        puVar32 = ppVar10->base;
                                        sVar34 = ppVar10->off;
                                        pppVar50 = &ppVar31->hashes[0].ctx;
                                        sVar49 = 0;
                                        do {
                                          (*(*pppVar50)->update)
                                                    (*pppVar50,puVar32 + sVar64,sVar34 - sVar64);
                                          sVar49 = sVar49 + 1;
                                          pppVar50 = pppVar50 + 2;
                                        } while (sVar49 != ppVar31->num_hashes);
                                      }
                                      iVar25 = (*emitter->commit_message)(emitter);
                                      if (iVar25 != 0) goto LAB_0011d0e4;
                                    }
                                    iVar25 = send_certificate_and_certificate_verify
                                                       (tls,emitter,&local_518.signature_algorithms,
                                                        (ptls_iovec_t)ZEXT816(0),
                                                        "TLS 1.3, server CertificateVerify",
                                                        (byte)local_518._1248_1_ & 1,
                                                        local_518.cert_compression_algos.list,
                                                        local_518.cert_compression_algos.count);
                                    if (iVar25 != 0) goto LAB_0011d0e4;
                                  }
                                  iVar25 = send_finished(tls,emitter);
                                  if (iVar25 == 0) {
                                    if (tls->key_schedule->generation != 2) {
                                      __assert_fail("tls->key_schedule->generation == 2",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                                                  ,0xfa4,
                                                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                                  );
                                    }
                                    iVar25 = key_schedule_extract
                                                       (tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
                                    if ((((iVar25 == 0) &&
                                         (iVar25 = setup_traffic_protection
                                                             (tls,1,"s ap traffic",3,0), iVar25 == 0
                                         )) && (iVar25 = derive_secret(tls->key_schedule,
                                                                       &tls->field_18,"c ap traffic"
                                                                      ), iVar25 == 0)) &&
                                       (iVar25 = derive_exporter_secret(tls,0), iVar25 == 0)) {
                                      ppVar36 = tls->ctx;
                                      if (tls->pending_handshake_secret == (uint8_t *)0x0) {
                                        if ((ppVar36->field_0x70 & 8) == 0) {
                                          tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
                                        }
                                        else {
                                          tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
                                        }
                                      }
                                      else if ((ppVar36->field_0x70 & 0x10) == 0) {
                                        tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
                                      }
                                      else {
                                        iVar25 = commission_handshake_secret(tls);
                                        if (iVar25 != 0) goto LAB_0011d0e4;
                                        tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
                                        ppVar36 = tls->ctx;
                                      }
                                      if ((local_518.psk.ke_modes != 0) &&
                                         (ppVar36->ticket_lifetime != 0)) {
                                        iVar25 = send_session_ticket(tls,emitter);
                                        if (iVar25 != 0) goto LAB_0011d0e4;
                                        ppVar36 = tls->ctx;
                                      }
                                      iVar25 = 0x202;
                                      if ((ppVar36->field_0x70 & 8) == 0) {
                                        iVar25 = 0;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_0011d0e4;
                }
              }
            }
            else {
              free(__ptr);
              iVar25 = 0x33;
LAB_0011f9d2:
              (*ctx->dispose_crypto)(ctx);
              (*ptls_clear_memory)(ctx->static_iv,ctx->algo->iv_size);
              local_640 = SUB82(ctx,0);
              uStack_63e = (undefined6)((ulong)ctx >> 0x10);
            }
            free((void *)CONCAT62(uStack_63e,local_640));
          }
          else {
            free(__ptr);
            if (ctx != (st_ptls_aead_context_t *)0x0) goto LAB_0011f9d2;
          }
        }
      }
      break;
    }
  }
LAB_0011f1bd:
  if (*esni != (ptls_esni_secret_t *)0x0) {
    free_esni_secret(esni,1);
  }
  goto LAB_0011d0e4;
LAB_0011dc1d:
  bVar67 = uVar5 == 0x29;
  ppVar61 = ppVar54;
  local_5a8.server_name.base = (uint8_t *)end;
LAB_0011db8c:
  ppVar44 = local_518.esni.cipher;
  puVar60 = local_518.random_bytes;
  iVar25 = 0x32;
  if (ppVar61 == ppVar1) {
    lVar47 = 0;
    iVar25 = 0x46;
    do {
      if (*(uint16_t *)((long)supported_versions + lVar47) == local_518.selected_version) {
        iVar25 = 0x2f;
        if (((local_518.compression_methods.count != 1) ||
            (*local_518.compression_methods.ids != '\0')) ||
           ((local_518.esni.cipher != (ptls_cipher_suite_t *)0x0 &&
            ((ushort *)local_518.key_shares.base == (ushort *)0x0)))) break;
        if ((ptls_key_exchange_algorithm_t *)local_518.psk.hash_end ==
            (ptls_key_exchange_algorithm_t *)0x0) {
          if (local_518.psk.early_data_indication != 0) break;
        }
        else if (!bVar67) break;
        ppVar36 = tls->ctx;
        if ((ppVar36->field_0x70 & 1) != 0) {
          local_518.psk.ke_modes = local_518.psk.ke_modes & 0xfffffffe;
        }
        if (eVar6 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
          uVar17 = *(undefined8 *)local_518.random_bytes;
          uVar18 = *(undefined8 *)(local_518.random_bytes + 8);
          uVar19 = *(undefined8 *)(local_518.random_bytes + 0x18);
          *(undefined8 *)(tls->client_random + 0x10) =
               *(undefined8 *)(local_518.random_bytes + 0x10);
          *(undefined8 *)(tls->client_random + 0x18) = uVar19;
          *(undefined8 *)tls->client_random = uVar17;
          *(undefined8 *)(tls->client_random + 8) = uVar18;
          if (local_518.legacy_session_id.len != 0) {
            tls->field_0x160 = tls->field_0x160 | 4;
          }
          if ((local_518.esni.cipher != (ptls_cipher_suite_t *)0x0) &&
             (ppVar36->esni != (ptls_esni_context_t **)0x0)) {
            local_5e8 = (st_ptls_aead_context_t *)0x0;
            if (tls->esni != (ptls_esni_secret_t *)0x0) {
              __assert_fail("*secret == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                            ,0xbcd,
                            "int client_hello_decrypt_esni(ptls_context_t *, ptls_iovec_t *, ptls_esni_secret_t **, struct st_ptls_client_hello_t *)"
                           );
            }
            esni = &tls->esni;
            ppVar29 = (ptls_esni_secret_t *)calloc(1,0xd0);
            puVar65 = local_518.esni.record_digest;
            *esni = ppVar29;
            if (ppVar29 == (ptls_esni_secret_t *)0x0) goto LAB_0011f09f;
            pppVar30 = ppVar36->esni;
            ppVar9 = *pppVar30;
            iVar24 = 0x2f;
            goto joined_r0x0011dd91;
          }
          bVar67 = true;
          local_640 = SUB82(local_518.server_name.base,0);
          uStack_63e = (undefined6)((ulong)local_518.server_name.base >> 0x10);
          if (local_518.server_name.base == (uint8_t *)0x0) {
            local_628 = (st_ptls_key_exchange_context_t **)0x0;
            local_640 = 0;
            uStack_63e = 0;
          }
          else {
            local_628 = (st_ptls_key_exchange_context_t **)local_518.server_name.len;
          }
          local_630._0_1_ = '\0';
          goto LAB_0011de5a;
        }
        iVar25 = 0x32;
        if (local_518.psk.early_data_indication == 0) {
          iVar24 = (*ptls_mem_equal)(tls->client_random,local_518.random_bytes,0x20);
          iVar25 = 0x28;
          if ((iVar24 != 0) &&
             ((pcVar8 = tls->server_name, pcVar8 == (char *)0x0 ||
              ((sVar28 = strlen(pcVar8), local_518.server_name.len == sVar28 &&
               (iVar24 = bcmp(local_518.server_name.base,pcVar8,sVar28), iVar24 == 0))))))
          goto LAB_0011df0b;
        }
        break;
      }
      lVar47 = lVar47 + 2;
    } while (lVar47 != 8);
  }
LAB_0011d0e4:
  free(local_538.base);
  if (local_5d8.base != (uint8_t *)0x0) {
    (*ptls_clear_memory)(local_5d8.base,local_5d8.len);
    free(local_5d8.base);
  }
  return iVar25;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions)                                                                            \
    ptls_push_message(emitter, (sched), PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                        \
        ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                             \
        if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                                \
            goto Exit;                                                                                                             \
        do {                                                                                                                       \
            fill_rand                                                                                                              \
        } while (0);                                                                                                               \
        emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                               \
        ptls_buffer_push_block(emitter->buf, 1,                                                                                    \
                               { ptls_buffer_pushv(emitter->buf, ch.legacy_session_id.base, ch.legacy_session_id.len); });         \
        ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                                   \
        ptls_buffer_push(emitter->buf, 0);                                                                                         \
        ptls_buffer_push_block(emitter->buf, 2, {                                                                                  \
            buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                            \
                                  { ptls_buffer_push16(emitter->buf, ch.selected_version); });                                     \
            do {                                                                                                                   \
                extensions                                                                                                         \
            } while (0);                                                                                                           \
        });                                                                                                                        \
    }